

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 uVar13;
  uint uVar14;
  int *piVar15;
  void *pvVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  float *pfVar21;
  _func_int **pp_Var22;
  _func_int **pp_Var23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  Mat *pMVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  _func_int *p_Var48;
  int iVar49;
  uint uVar50;
  _func_int *p_Var51;
  int iVar52;
  ulong uVar53;
  _func_int ***ppp_Var54;
  int w_2;
  ulong uVar55;
  uint uVar56;
  ulong uVar57;
  _func_int **pp_Var58;
  long lVar59;
  void *pvVar60;
  ulong uVar61;
  int y_3;
  uint uVar62;
  int w;
  int iVar63;
  int iVar64;
  int w_1;
  int iVar65;
  ulong uVar66;
  int y_1;
  int iVar67;
  void *pvVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar142 [32];
  float fVar155;
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [28];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar229;
  float fVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar235 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  __m128 one;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [64];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [64];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [16];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar449 [16];
  undefined1 auVar453 [64];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [64];
  undefined1 auVar460 [64];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  float fVar486;
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [64];
  int outh_2;
  int outw_1;
  int outw;
  int h;
  int outh_1;
  int h_1;
  int outh;
  int h_2;
  long local_198;
  long local_170;
  _func_int ***local_168;
  long local_158;
  _func_int ***local_150;
  void *local_140;
  uint local_134;
  _func_int ***local_128;
  ulong local_b0;
  Mat local_a8;
  long local_60;
  Allocator *local_58;
  long local_50;
  Mat *local_48;
  Option *local_40;
  Allocator *local_38;
  undefined1 auVar139 [32];
  undefined1 auVar145 [32];
  undefined1 auVar150 [32];
  undefined1 auVar224 [32];
  undefined1 auVar257 [32];
  
  iVar6 = bottom_blob->w;
  iVar7 = bottom_blob->h;
  uVar53 = bottom_blob->elemsize;
  uVar8 = bottom_blob->elempack;
  p_Var48 = this->_vptr_Deconvolution_x86_fma[-3];
  local_134 = 1;
  if (opt->use_packing_layout == true) {
    local_134 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var48) & 7) != 0) {
      local_134 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var48) & 3) == 0) * 3 + 1;
    }
  }
  iVar63 = *(int *)(&this->field_0xd4 + (long)p_Var48);
  iVar9 = *(int *)(&this->field_0xe4 + (long)p_Var48);
  iVar49 = (*(int *)(&this->field_0xd8 + (long)p_Var48) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var48);
  local_60 = CONCAT44(local_60._4_4_,iVar49);
  iVar67 = *(int *)(&this->field_0xdc + (long)p_Var48);
  iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
  iVar52 = *(int *)(&this->field_0xfc + (long)p_Var48);
  iVar65 = *(int *)(&this->field_0x100 + (long)p_Var48);
  local_a8.cstep = 0;
  local_a8.data = (Allocator *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_a8.elempack = 0;
  local_a8.h = 0;
  p_Var51 = this->_vptr_Deconvolution_x86_fma[-3];
  p_Var48 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_fma + (long)p_Var51);
  lVar59 = 0x10;
  local_a8.allocator = (Allocator *)local_a8.data;
  local_a8.dims = (int)local_a8.refcount;
  local_a8.w = local_a8.refcount._4_4_;
  local_a8.d = (int)local_a8.refcount;
  local_a8.c = local_a8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var51) < 1) && (*(int *)(p_Var48 + 0xf0) < 1)) &&
       (*(int *)(p_Var48 + 0xf4) < 1)) && (*(int *)(p_Var48 + 0xf8) < 1)) &&
     ((*(int *)(p_Var48 + 0x104) < 1 || (*(int *)(p_Var48 + 0x108) < 1)))) {
    if (&local_a8 != top_blob) {
      piVar15 = top_blob->refcount;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      local_a8.data = top_blob->data;
      local_a8.refcount._0_4_ = (int)top_blob->refcount;
      local_a8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_a8.elemsize = top_blob->elemsize;
      local_a8.elempack = top_blob->elempack;
      local_a8.allocator = top_blob->allocator;
      uVar2 = top_blob->dims;
      uVar3 = top_blob->w;
      uVar4 = top_blob->h;
      uVar5 = top_blob->d;
      local_a8.c = top_blob->c;
      local_a8.cstep = top_blob->cstep;
      p_Var51 = this->_vptr_Deconvolution_x86_fma[-3];
      local_a8.dims = uVar2;
      local_a8.w = uVar3;
      local_a8.h = uVar4;
      local_a8.d = uVar5;
    }
    p_Var48 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_fma + (long)p_Var51);
    lVar59 = 8;
  }
  iVar67 = (iVar63 + -1) * iVar67;
  local_58 = (Allocator *)CONCAT44(local_58._4_4_,iVar67);
  local_48 = top_blob;
  local_40 = opt;
  Mat::create(&local_a8,iVar52 + (iVar6 + -1) * iVar9 + iVar67 + 1,
              iVar65 + (iVar7 + -1) * iVar10 + iVar49 + 1,*(int *)(p_Var48 + 0xd0) / (int)local_134,
              (uVar53 / (ulong)(long)(int)uVar8) * (ulong)local_134,local_134,
              *(Allocator **)(&opt->lightmode + lVar59));
  iVar7 = local_a8.h;
  iVar6 = local_a8.w;
  iVar63 = -100;
  if (((Allocator *)local_a8.data == (Allocator *)0x0) || (local_a8.cstep * (long)local_a8.c == 0))
  goto LAB_002a59fd;
  pp_Var58 = this->_vptr_Deconvolution_x86_fma;
  p_Var48 = pp_Var58[-3];
  uVar11 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
  uVar12 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
  if ((uVar8 == 8) && (local_134 == 8)) {
    if (0 < local_a8.c) {
      iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      local_158 = 0;
      auVar388 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar396 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar341 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar456._8_4_ = 0x3d2aa9c1;
      auVar456._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar456._12_4_ = 0x3d2aa9c1;
      auVar456._16_4_ = 0x3d2aa9c1;
      auVar456._20_4_ = 0x3d2aa9c1;
      auVar456._24_4_ = 0x3d2aa9c1;
      auVar456._28_4_ = 0x3d2aa9c1;
      auVar148._8_4_ = 0xbf800000;
      auVar148._0_8_ = 0xbf800000bf800000;
      auVar148._12_4_ = 0xbf800000;
      auVar148._16_4_ = 0xbf800000;
      auVar148._20_4_ = 0xbf800000;
      auVar148._24_4_ = 0xbf800000;
      auVar148._28_4_ = 0xbf800000;
      do {
        if (0 < local_a8.h) {
          iVar52 = bottom_blob->w;
          iVar65 = bottom_blob->h;
          ppp_Var54 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_158 * local_a8.elemsize);
          uVar50 = bottom_blob->c;
          iVar49 = 0;
          do {
            if (0 < local_a8.w) {
              uVar56 = 0;
              iVar64 = (1 - uVar11) * iVar63;
              do {
                if (lVar59 == 0) {
                  auVar153 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar153 = ZEXT3264(*(undefined1 (*) [32])(lVar59 + local_158 * 0x20));
                }
                if (0 < (int)uVar50) {
                  pvVar68 = (void *)((this->weight_data_tm).cstep * local_158 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar55 = 0;
                      uVar57 = 0;
                      do {
                        iVar40 = (((int)uVar57 - uVar12) + 1) * iVar9 + iVar49;
                        if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar10, iVar40 % iVar10 == 0)) &&
                            (0 < (int)uVar11)) && (iVar41 < iVar65)) {
                          lVar47 = (long)iVar41 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar53;
                          uVar61 = (ulong)uVar11;
                          uVar66 = uVar55;
                          iVar40 = iVar64;
                          do {
                            if (((-1 < iVar40) && (iVar41 = iVar40 / iVar67, iVar40 % iVar67 == 0))
                               && (iVar41 < iVar52)) {
                              lVar45 = (long)(iVar41 << 3);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47);
                              auVar142._4_4_ = uVar1;
                              auVar142._0_4_ = uVar1;
                              auVar142._8_4_ = uVar1;
                              auVar142._12_4_ = uVar1;
                              auVar142._16_4_ = uVar1;
                              auVar142._20_4_ = uVar1;
                              auVar142._24_4_ = uVar1;
                              auVar142._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 4);
                              auVar144._4_4_ = uVar1;
                              auVar144._0_4_ = uVar1;
                              auVar144._8_4_ = uVar1;
                              auVar144._12_4_ = uVar1;
                              auVar144._16_4_ = uVar1;
                              auVar144._20_4_ = uVar1;
                              auVar144._24_4_ = uVar1;
                              auVar144._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 8);
                              auVar138._4_4_ = uVar1;
                              auVar138._0_4_ = uVar1;
                              auVar138._8_4_ = uVar1;
                              auVar138._12_4_ = uVar1;
                              auVar138._16_4_ = uVar1;
                              auVar138._20_4_ = uVar1;
                              auVar138._24_4_ = uVar1;
                              auVar138._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0xc);
                              auVar220._4_4_ = uVar1;
                              auVar220._0_4_ = uVar1;
                              auVar220._8_4_ = uVar1;
                              auVar220._12_4_ = uVar1;
                              auVar220._16_4_ = uVar1;
                              auVar220._20_4_ = uVar1;
                              auVar220._24_4_ = uVar1;
                              auVar220._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x10);
                              auVar209._4_4_ = uVar1;
                              auVar209._0_4_ = uVar1;
                              auVar209._8_4_ = uVar1;
                              auVar209._12_4_ = uVar1;
                              auVar209._16_4_ = uVar1;
                              auVar209._20_4_ = uVar1;
                              auVar209._24_4_ = uVar1;
                              auVar209._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x14);
                              auVar476._4_4_ = uVar1;
                              auVar476._0_4_ = uVar1;
                              auVar476._8_4_ = uVar1;
                              auVar476._12_4_ = uVar1;
                              auVar476._16_4_ = uVar1;
                              auVar476._20_4_ = uVar1;
                              auVar476._24_4_ = uVar1;
                              auVar476._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x18);
                              auVar445._4_4_ = uVar1;
                              auVar445._0_4_ = uVar1;
                              auVar445._8_4_ = uVar1;
                              auVar445._12_4_ = uVar1;
                              auVar445._16_4_ = uVar1;
                              auVar445._20_4_ = uVar1;
                              auVar445._24_4_ = uVar1;
                              auVar445._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x1c);
                              auVar450._4_4_ = uVar1;
                              auVar450._0_4_ = uVar1;
                              auVar450._8_4_ = uVar1;
                              auVar450._12_4_ = uVar1;
                              auVar450._16_4_ = uVar1;
                              auVar450._20_4_ = uVar1;
                              auVar450._24_4_ = uVar1;
                              auVar450._28_4_ = uVar1;
                              uVar46 = uVar66 & 0xffffffff;
                              auVar231 = vfmadd231ps_fma(auVar153._0_32_,auVar142,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar144,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x20));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar138,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x40));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar220,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x60));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar209,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x80));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar476,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0xa0));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar445,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0xc0));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar450,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0xe0));
                              auVar153 = ZEXT1664(auVar231);
                            }
                            uVar66 = uVar66 + 0x40;
                            iVar40 = iVar40 + iVar63;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar57 = uVar57 + 1;
                        uVar55 = uVar55 + (ulong)uVar11 * 0x40;
                      } while (uVar57 != uVar12);
                    }
                    pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar11 * uVar12 * 0x40) * 4);
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar50);
                }
                auVar142 = auVar153._0_32_;
                auVar138 = auVar388._0_32_;
                auVar144 = auVar341._0_32_;
                auVar220 = auVar396._0_32_;
                fVar70 = auVar341._0_4_;
                fVar69 = auVar341._4_4_;
                fVar486 = auVar341._8_4_;
                fVar229 = auVar341._12_4_;
                fVar230 = auVar341._16_4_;
                fVar24 = auVar341._20_4_;
                fVar155 = auVar341._24_4_;
                fVar25 = auVar341._28_4_;
                auVar459._28_36_ = auVar153._28_36_;
                switch(uVar13) {
                case 1:
                  auVar142 = vmaxps_avx(auVar138,auVar142);
                  break;
                case 2:
                  auVar144 = vmaxps_avx(auVar138,auVar142);
                  auVar142 = vminps_avx(auVar138,auVar142);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar141._4_4_ = uVar1;
                  auVar141._0_4_ = uVar1;
                  auVar141._8_4_ = uVar1;
                  auVar141._12_4_ = uVar1;
                  auVar141._16_4_ = uVar1;
                  auVar141._20_4_ = uVar1;
                  auVar141._24_4_ = uVar1;
                  auVar141._28_4_ = uVar1;
                  auVar231 = vfmadd213ps_fma(auVar141,auVar142,auVar144);
                  auVar142 = ZEXT1632(auVar231);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar202._4_4_ = uVar1;
                  auVar202._0_4_ = uVar1;
                  auVar202._8_4_ = uVar1;
                  auVar202._12_4_ = uVar1;
                  auVar202._16_4_ = uVar1;
                  auVar202._20_4_ = uVar1;
                  auVar202._24_4_ = uVar1;
                  auVar202._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar479._4_4_ = uVar1;
                  auVar479._0_4_ = uVar1;
                  auVar479._8_4_ = uVar1;
                  auVar479._12_4_ = uVar1;
                  auVar479._16_4_ = uVar1;
                  auVar479._20_4_ = uVar1;
                  auVar479._24_4_ = uVar1;
                  auVar479._28_4_ = uVar1;
                  auVar142 = vmaxps_avx(auVar142,auVar202);
                  auVar142 = vminps_avx(auVar479,auVar142);
                  break;
                case 4:
                  auVar137._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
                  auVar137._8_4_ = -auVar153._8_4_;
                  auVar137._12_4_ = -auVar153._12_4_;
                  auVar137._16_4_ = -auVar153._16_4_;
                  auVar137._20_4_ = -auVar153._20_4_;
                  auVar137._24_4_ = -auVar153._24_4_;
                  auVar137._28_4_ = auVar153._28_4_ ^ 0x80000000;
                  auVar203._8_4_ = 0x42b0c0a5;
                  auVar203._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar203._12_4_ = 0x42b0c0a5;
                  auVar203._16_4_ = 0x42b0c0a5;
                  auVar203._20_4_ = 0x42b0c0a5;
                  auVar203._24_4_ = 0x42b0c0a5;
                  auVar203._28_4_ = 0x42b0c0a5;
                  auVar142 = vminps_avx(auVar137,auVar203);
                  auVar204._8_4_ = 0xc2b0c0a5;
                  auVar204._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar204._12_4_ = 0xc2b0c0a5;
                  auVar204._16_4_ = 0xc2b0c0a5;
                  auVar204._20_4_ = 0xc2b0c0a5;
                  auVar204._24_4_ = 0xc2b0c0a5;
                  auVar204._28_4_ = 0xc2b0c0a5;
                  auVar138 = vmaxps_avx(auVar142,auVar204);
                  auVar205._8_4_ = 0x3fb8aa3b;
                  auVar205._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar205._12_4_ = 0x3fb8aa3b;
                  auVar205._16_4_ = 0x3fb8aa3b;
                  auVar205._20_4_ = 0x3fb8aa3b;
                  auVar205._24_4_ = 0x3fb8aa3b;
                  auVar205._28_4_ = 0x3fb8aa3b;
                  auVar231 = vfmadd213ps_fma(auVar205,auVar138,auVar220);
                  auVar209 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar142 = vcmpps_avx(ZEXT1632(auVar231),auVar209,1);
                  auVar142 = vandps_avx(auVar142,auVar144);
                  auVar142 = vsubps_avx(auVar209,auVar142);
                  auVar90._8_4_ = 0x3f318000;
                  auVar90._0_8_ = 0x3f3180003f318000;
                  auVar90._12_4_ = 0x3f318000;
                  auVar90._16_4_ = 0x3f318000;
                  auVar90._20_4_ = 0x3f318000;
                  auVar90._24_4_ = 0x3f318000;
                  auVar90._28_4_ = 0x3f318000;
                  auVar231 = vfmsub231ps_fma(auVar138,auVar142,auVar90);
                  auVar245._8_4_ = 0x395e8083;
                  auVar245._0_8_ = 0x395e8083395e8083;
                  auVar245._12_4_ = 0x395e8083;
                  auVar245._16_4_ = 0x395e8083;
                  auVar245._20_4_ = 0x395e8083;
                  auVar245._24_4_ = 0x395e8083;
                  auVar245._28_4_ = 0x395e8083;
                  auVar397 = vfmsub231ps_fma(ZEXT1632(auVar231),auVar142,auVar245);
                  auVar138 = ZEXT1632(auVar397);
                  auVar29._28_4_ = auVar209._28_4_;
                  auVar29._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar413._8_4_ = 0x39506967;
                  auVar413._0_8_ = 0x3950696739506967;
                  auVar413._12_4_ = 0x39506967;
                  auVar413._16_4_ = 0x39506967;
                  auVar413._20_4_ = 0x39506967;
                  auVar413._24_4_ = 0x39506967;
                  auVar413._28_4_ = 0x39506967;
                  auVar246._8_4_ = 0x3ab743ce;
                  auVar246._0_8_ = 0x3ab743ce3ab743ce;
                  auVar246._12_4_ = 0x3ab743ce;
                  auVar246._16_4_ = 0x3ab743ce;
                  auVar246._20_4_ = 0x3ab743ce;
                  auVar246._24_4_ = 0x3ab743ce;
                  auVar246._28_4_ = 0x3ab743ce;
                  auVar231 = vfmadd213ps_fma(auVar413,auVar138,auVar246);
                  auVar91._8_4_ = 0x3c088908;
                  auVar91._0_8_ = 0x3c0889083c088908;
                  auVar91._12_4_ = 0x3c088908;
                  auVar91._16_4_ = 0x3c088908;
                  auVar91._20_4_ = 0x3c088908;
                  auVar91._24_4_ = 0x3c088908;
                  auVar91._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar91);
                  auVar92._8_4_ = 0x3d2aa9c1;
                  auVar92._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar92._12_4_ = 0x3d2aa9c1;
                  auVar92._16_4_ = 0x3d2aa9c1;
                  auVar92._20_4_ = 0x3d2aa9c1;
                  auVar92._24_4_ = 0x3d2aa9c1;
                  auVar92._28_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar92);
                  auVar93._8_4_ = 0x3e2aaaaa;
                  auVar93._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar93._12_4_ = 0x3e2aaaaa;
                  auVar93._16_4_ = 0x3e2aaaaa;
                  auVar93._20_4_ = 0x3e2aaaaa;
                  auVar93._24_4_ = 0x3e2aaaaa;
                  auVar93._28_4_ = 0x3e2aaaaa;
                  auVar138 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar93);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar220);
                  auVar350 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar29,auVar138);
                  auVar112._0_4_ = (int)auVar142._0_4_;
                  auVar112._4_4_ = (int)auVar142._4_4_;
                  auVar112._8_4_ = (int)auVar142._8_4_;
                  auVar112._12_4_ = (int)auVar142._12_4_;
                  auVar139._16_4_ = (int)auVar142._16_4_;
                  auVar139._0_16_ = auVar112;
                  auVar139._20_4_ = (int)auVar142._20_4_;
                  auVar139._24_4_ = (int)auVar142._24_4_;
                  auVar139._28_4_ = (int)auVar142._28_4_;
                  auVar397 = vpslld_avx(auVar112,0x17);
                  auVar231 = vpslld_avx(auVar139._16_16_,0x17);
                  auVar71._8_4_ = 0x3f800000;
                  auVar71._0_8_ = 0x3f8000003f800000;
                  auVar71._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar231,auVar71);
                  auVar397 = vpaddd_avx(auVar397,auVar71);
                  auVar140._16_16_ = auVar231;
                  auVar140._0_16_ = auVar397;
                  auVar206._0_4_ = auVar350._0_4_ + fVar70;
                  auVar206._4_4_ = auVar350._4_4_ + fVar69;
                  auVar206._8_4_ = auVar350._8_4_ + fVar486;
                  auVar206._12_4_ = auVar350._12_4_ + fVar229;
                  auVar206._16_4_ = fVar230 + 0.0;
                  auVar206._20_4_ = fVar24 + 0.0;
                  auVar206._24_4_ = fVar155 + 0.0;
                  auVar206._28_4_ = fVar25 + 0.0;
                  auVar231 = vfmadd213ps_fma(auVar140,auVar206,auVar144);
                  auVar142 = vrcpps_avx(ZEXT1632(auVar231));
                  auVar231 = vfmsub213ps_fma(ZEXT1632(auVar231),auVar142,auVar144);
                  auVar231 = vfnmadd132ps_fma(ZEXT1632(auVar231),auVar142,auVar142);
                  auVar142 = ZEXT1632(auVar231);
                  break;
                case 5:
                  auVar446._8_4_ = 0x42b0c0a5;
                  auVar446._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar446._12_4_ = 0x42b0c0a5;
                  auVar446._16_4_ = 0x42b0c0a5;
                  auVar446._20_4_ = 0x42b0c0a5;
                  auVar446._24_4_ = 0x42b0c0a5;
                  auVar446._28_4_ = 0x42b0c0a5;
                  auVar142 = vminps_avx(auVar446,auVar142);
                  auVar451._8_4_ = 0xc2b0c0a5;
                  auVar451._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar451._12_4_ = 0xc2b0c0a5;
                  auVar451._16_4_ = 0xc2b0c0a5;
                  auVar451._20_4_ = 0xc2b0c0a5;
                  auVar451._24_4_ = 0xc2b0c0a5;
                  auVar451._28_4_ = 0xc2b0c0a5;
                  auVar138 = vmaxps_avx(auVar451,auVar142);
                  auVar409._8_4_ = 0x3fb8aa3b;
                  auVar409._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar409._12_4_ = 0x3fb8aa3b;
                  auVar409._16_4_ = 0x3fb8aa3b;
                  auVar409._20_4_ = 0x3fb8aa3b;
                  auVar409._24_4_ = 0x3fb8aa3b;
                  auVar409._28_4_ = 0x3fb8aa3b;
                  auVar231 = vfmadd213ps_fma(auVar409,auVar138,auVar220);
                  auVar209 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar142 = vcmpps_avx(ZEXT1632(auVar231),auVar209,1);
                  auVar142 = vandps_avx(auVar142,auVar144);
                  auVar142 = vsubps_avx(auVar209,auVar142);
                  auVar367._8_4_ = 0x3f318000;
                  auVar367._0_8_ = 0x3f3180003f318000;
                  auVar367._12_4_ = 0x3f318000;
                  auVar367._16_4_ = 0x3f318000;
                  auVar367._20_4_ = 0x3f318000;
                  auVar367._24_4_ = 0x3f318000;
                  auVar367._28_4_ = 0x3f318000;
                  auVar231 = vfmsub231ps_fma(auVar138,auVar142,auVar367);
                  auVar447._8_4_ = 0xb95e8083;
                  auVar447._0_8_ = 0xb95e8083b95e8083;
                  auVar447._12_4_ = 0xb95e8083;
                  auVar447._16_4_ = 0xb95e8083;
                  auVar447._20_4_ = 0xb95e8083;
                  auVar447._24_4_ = 0xb95e8083;
                  auVar447._28_4_ = 0xb95e8083;
                  auVar397 = vfnmsub231ps_fma(ZEXT1632(auVar231),auVar142,auVar447);
                  auVar138 = ZEXT1632(auVar397);
                  auVar26._28_4_ = auVar209._28_4_;
                  auVar26._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar237._8_4_ = 0x39506967;
                  auVar237._0_8_ = 0x3950696739506967;
                  auVar237._12_4_ = 0x39506967;
                  auVar237._16_4_ = 0x39506967;
                  auVar237._20_4_ = 0x39506967;
                  auVar237._24_4_ = 0x39506967;
                  auVar237._28_4_ = 0x39506967;
                  auVar394._8_4_ = 0x3ab743ce;
                  auVar394._0_8_ = 0x3ab743ce3ab743ce;
                  auVar394._12_4_ = 0x3ab743ce;
                  auVar394._16_4_ = 0x3ab743ce;
                  auVar394._20_4_ = 0x3ab743ce;
                  auVar394._24_4_ = 0x3ab743ce;
                  auVar394._28_4_ = 0x3ab743ce;
                  auVar231 = vfmadd213ps_fma(auVar237,auVar138,auVar394);
                  auVar452._8_4_ = 0x3c088908;
                  auVar452._0_8_ = 0x3c0889083c088908;
                  auVar452._12_4_ = 0x3c088908;
                  auVar452._16_4_ = 0x3c088908;
                  auVar452._20_4_ = 0x3c088908;
                  auVar452._24_4_ = 0x3c088908;
                  auVar452._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar452);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar456);
                  auVar395._8_4_ = 0x3e2aaaaa;
                  auVar395._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar395._12_4_ = 0x3e2aaaaa;
                  auVar395._16_4_ = 0x3e2aaaaa;
                  auVar395._20_4_ = 0x3e2aaaaa;
                  auVar395._24_4_ = 0x3e2aaaaa;
                  auVar395._28_4_ = 0x3e2aaaaa;
                  auVar138 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar395);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar220);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar26,auVar138);
                  auVar196._0_4_ = auVar231._0_4_ + fVar70;
                  auVar196._4_4_ = auVar231._4_4_ + fVar69;
                  auVar196._8_4_ = auVar231._8_4_ + fVar486;
                  auVar196._12_4_ = auVar231._12_4_ + fVar229;
                  auVar196._16_4_ = fVar230 + 0.0;
                  auVar196._20_4_ = fVar24 + 0.0;
                  auVar196._24_4_ = fVar155 + 0.0;
                  auVar196._28_4_ = fVar25 + 0.0;
                  auVar397._0_4_ = (int)auVar142._0_4_;
                  auVar397._4_4_ = (int)auVar142._4_4_;
                  auVar397._8_4_ = (int)auVar142._8_4_;
                  auVar397._12_4_ = (int)auVar142._12_4_;
                  auVar238._16_4_ = (int)auVar142._16_4_;
                  auVar238._0_16_ = auVar397;
                  auVar238._20_4_ = (int)auVar142._20_4_;
                  auVar238._24_4_ = (int)auVar142._24_4_;
                  auVar238._28_4_ = (int)auVar142._28_4_;
                  auVar397 = vpslld_avx(auVar397,0x17);
                  auVar231 = vpslld_avx(auVar238._16_16_,0x17);
                  auVar128._8_4_ = 0x3f800000;
                  auVar128._0_8_ = 0x3f8000003f800000;
                  auVar128._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar231,auVar128);
                  auVar397 = vpaddd_avx(auVar397,auVar128);
                  auVar477._16_16_ = auVar231;
                  auVar477._0_16_ = auVar397;
                  auVar350 = vfmadd213ps_fma(auVar477,auVar196,auVar144);
                  auVar197._8_4_ = 0x800000;
                  auVar197._0_8_ = 0x80000000800000;
                  auVar197._12_4_ = 0x800000;
                  auVar197._16_4_ = 0x800000;
                  auVar197._20_4_ = 0x800000;
                  auVar197._24_4_ = 0x800000;
                  auVar197._28_4_ = 0x800000;
                  auVar142 = vmaxps_avx(ZEXT1632(auVar350),auVar197);
                  auVar397 = vpsrld_avx(auVar142._0_16_,0x17);
                  auVar231 = vpsrld_avx(auVar142._16_16_,0x17);
                  auVar334._8_4_ = 0x807fffff;
                  auVar334._0_8_ = 0x807fffff807fffff;
                  auVar334._12_4_ = 0x807fffff;
                  auVar334._16_4_ = 0x807fffff;
                  auVar334._20_4_ = 0x807fffff;
                  auVar334._24_4_ = 0x807fffff;
                  auVar334._28_4_ = 0x807fffff;
                  auVar142 = vandps_avx(auVar142,auVar334);
                  auVar209 = vorps_avx(auVar142,auVar220);
                  auVar335._8_4_ = 0x3f3504f3;
                  auVar335._0_8_ = 0x3f3504f33f3504f3;
                  auVar335._12_4_ = 0x3f3504f3;
                  auVar335._16_4_ = 0x3f3504f3;
                  auVar335._20_4_ = 0x3f3504f3;
                  auVar335._24_4_ = 0x3f3504f3;
                  auVar335._28_4_ = 0x3f3504f3;
                  auVar138 = vcmpps_avx(auVar335,auVar209,2);
                  auVar142 = vandnps_avx(auVar138,auVar209);
                  auVar198._0_4_ = auVar142._0_4_ + auVar209._0_4_ + -1.0;
                  auVar198._4_4_ = auVar142._4_4_ + auVar209._4_4_ + -1.0;
                  auVar198._8_4_ = auVar142._8_4_ + auVar209._8_4_ + -1.0;
                  auVar198._12_4_ = auVar142._12_4_ + auVar209._12_4_ + -1.0;
                  auVar198._16_4_ = auVar142._16_4_ + auVar209._16_4_ + -1.0;
                  auVar198._20_4_ = auVar142._20_4_ + auVar209._20_4_ + -1.0;
                  auVar198._24_4_ = auVar142._24_4_ + auVar209._24_4_ + -1.0;
                  auVar198._28_4_ = auVar142._28_4_ + auVar209._28_4_ + -1.0;
                  auVar231 = vpsubd_avx(auVar231,auVar138._16_16_);
                  auVar419._8_4_ = 0xffffff81;
                  auVar419._0_8_ = 0xffffff81ffffff81;
                  auVar419._12_4_ = 0xffffff81;
                  auVar231 = vpaddd_avx(auVar231,auVar419);
                  auVar397 = vpsubd_avx(auVar397,auVar138._0_16_);
                  auVar397 = vpaddd_avx(auVar419,auVar397);
                  auVar239._16_16_ = auVar231;
                  auVar239._0_16_ = auVar397;
                  auVar27._4_4_ = auVar198._4_4_ * auVar198._4_4_;
                  auVar27._0_4_ = auVar198._0_4_ * auVar198._0_4_;
                  auVar27._8_4_ = auVar198._8_4_ * auVar198._8_4_;
                  auVar27._12_4_ = auVar198._12_4_ * auVar198._12_4_;
                  auVar27._16_4_ = auVar198._16_4_ * auVar198._16_4_;
                  auVar27._20_4_ = auVar198._20_4_ * auVar198._20_4_;
                  auVar27._24_4_ = auVar198._24_4_ * auVar198._24_4_;
                  auVar27._28_4_ = auVar138._28_4_;
                  auVar410._8_4_ = 0x3d9021bb;
                  auVar410._0_8_ = 0x3d9021bb3d9021bb;
                  auVar410._12_4_ = 0x3d9021bb;
                  auVar410._16_4_ = 0x3d9021bb;
                  auVar410._20_4_ = 0x3d9021bb;
                  auVar410._24_4_ = 0x3d9021bb;
                  auVar410._28_4_ = 0x3d9021bb;
                  auVar427._8_4_ = 0xbdebd1b8;
                  auVar427._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar427._12_4_ = 0xbdebd1b8;
                  auVar427._16_4_ = 0xbdebd1b8;
                  auVar427._20_4_ = 0xbdebd1b8;
                  auVar427._24_4_ = 0xbdebd1b8;
                  auVar427._28_4_ = 0xbdebd1b8;
                  auVar231 = vfmadd213ps_fma(auVar410,auVar198,auVar427);
                  auVar428._8_4_ = 0x3def251a;
                  auVar428._0_8_ = 0x3def251a3def251a;
                  auVar428._12_4_ = 0x3def251a;
                  auVar428._16_4_ = 0x3def251a;
                  auVar428._20_4_ = 0x3def251a;
                  auVar428._24_4_ = 0x3def251a;
                  auVar428._28_4_ = 0x3def251a;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar198,auVar428);
                  auVar429._8_4_ = 0xbdfe5d4f;
                  auVar429._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar429._12_4_ = 0xbdfe5d4f;
                  auVar429._16_4_ = 0xbdfe5d4f;
                  auVar429._20_4_ = 0xbdfe5d4f;
                  auVar429._24_4_ = 0xbdfe5d4f;
                  auVar429._28_4_ = 0xbdfe5d4f;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar198,auVar429);
                  auVar430._8_4_ = 0x3e11e9bf;
                  auVar430._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar430._12_4_ = 0x3e11e9bf;
                  auVar430._16_4_ = 0x3e11e9bf;
                  auVar430._20_4_ = 0x3e11e9bf;
                  auVar430._24_4_ = 0x3e11e9bf;
                  auVar430._28_4_ = 0x3e11e9bf;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar198,auVar430);
                  auVar431._8_4_ = 0xbe2aae50;
                  auVar431._0_8_ = 0xbe2aae50be2aae50;
                  auVar431._12_4_ = 0xbe2aae50;
                  auVar431._16_4_ = 0xbe2aae50;
                  auVar431._20_4_ = 0xbe2aae50;
                  auVar431._24_4_ = 0xbe2aae50;
                  auVar431._28_4_ = 0xbe2aae50;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar198,auVar431);
                  auVar432._8_4_ = 0x3e4cceac;
                  auVar432._0_8_ = 0x3e4cceac3e4cceac;
                  auVar432._12_4_ = 0x3e4cceac;
                  auVar432._16_4_ = 0x3e4cceac;
                  auVar432._20_4_ = 0x3e4cceac;
                  auVar432._24_4_ = 0x3e4cceac;
                  auVar432._28_4_ = 0x3e4cceac;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar198,auVar432);
                  auVar433._8_4_ = 0xbe7ffffc;
                  auVar433._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar433._12_4_ = 0xbe7ffffc;
                  auVar433._16_4_ = 0xbe7ffffc;
                  auVar433._20_4_ = 0xbe7ffffc;
                  auVar433._24_4_ = 0xbe7ffffc;
                  auVar433._28_4_ = 0xbe7ffffc;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar198,auVar433);
                  auVar434._8_4_ = 0x3eaaaaaa;
                  auVar434._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar434._12_4_ = 0x3eaaaaaa;
                  auVar434._16_4_ = 0x3eaaaaaa;
                  auVar434._20_4_ = 0x3eaaaaaa;
                  auVar434._24_4_ = 0x3eaaaaaa;
                  auVar434._28_4_ = 0x3eaaaaaa;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar198,auVar434);
                  auVar411._0_4_ = auVar198._0_4_ * auVar198._0_4_ * auVar198._0_4_ * auVar231._0_4_
                  ;
                  auVar411._4_4_ = auVar198._4_4_ * auVar198._4_4_ * auVar198._4_4_ * auVar231._4_4_
                  ;
                  auVar411._8_4_ = auVar198._8_4_ * auVar198._8_4_ * auVar198._8_4_ * auVar231._8_4_
                  ;
                  auVar411._12_4_ =
                       auVar198._12_4_ * auVar198._12_4_ * auVar198._12_4_ * auVar231._12_4_;
                  auVar411._16_4_ = auVar198._16_4_ * auVar198._16_4_ * auVar198._16_4_ * 0.0;
                  auVar411._20_4_ = auVar198._20_4_ * auVar198._20_4_ * auVar198._20_4_ * 0.0;
                  auVar411._24_4_ = auVar198._24_4_ * auVar198._24_4_ * auVar198._24_4_ * 0.0;
                  auVar411._28_4_ = 0;
                  auVar138 = vcvtdq2ps_avx(auVar239);
                  auVar231 = vfmadd231ps_fma(auVar411,auVar138,auVar447);
                  auVar231 = vfmsub231ps_fma(ZEXT1632(auVar231),auVar220,auVar27);
                  auVar142 = vcmpps_avx(ZEXT1632(auVar350),_DAT_0051a220,2);
                  auVar209 = vsubps_avx(ZEXT1632(auVar231),auVar198);
                  auVar231 = vfmsub231ps_fma(auVar209,auVar367,auVar138);
                  auVar478._8_4_ = 0xc0000000;
                  auVar478._0_8_ = 0xc0000000c0000000;
                  auVar478._12_4_ = 0xc0000000;
                  auVar478._16_4_ = 0xc0000000;
                  auVar478._20_4_ = 0xc0000000;
                  auVar478._24_4_ = 0xc0000000;
                  auVar478._28_4_ = 0xc0000000;
                  auVar199._0_4_ = auVar231._0_4_ * -2.0;
                  auVar199._4_4_ = auVar231._4_4_ * -2.0;
                  auVar199._8_4_ = auVar231._8_4_ * -2.0;
                  auVar199._12_4_ = auVar231._12_4_ * -2.0;
                  auVar199._16_4_ = 0x80000000;
                  auVar199._20_4_ = 0x80000000;
                  auVar199._24_4_ = 0x80000000;
                  auVar199._28_4_ = 0;
                  auVar240._8_4_ = 0x7fffffff;
                  auVar240._0_8_ = 0x7fffffff7fffffff;
                  auVar240._12_4_ = 0x7fffffff;
                  auVar240._16_4_ = 0x7fffffff;
                  auVar240._20_4_ = 0x7fffffff;
                  auVar240._24_4_ = 0x7fffffff;
                  auVar240._28_4_ = 0x7fffffff;
                  auVar142 = vblendvps_avx(auVar199,auVar240,auVar142);
                  auVar241._8_4_ = 0x42b0c0a5;
                  auVar241._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar241._12_4_ = 0x42b0c0a5;
                  auVar241._16_4_ = 0x42b0c0a5;
                  auVar241._20_4_ = 0x42b0c0a5;
                  auVar241._24_4_ = 0x42b0c0a5;
                  auVar241._28_4_ = 0x42b0c0a5;
                  auVar142 = vminps_avx(auVar142,auVar241);
                  auVar242._8_4_ = 0xc2b0c0a5;
                  auVar242._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar242._12_4_ = 0xc2b0c0a5;
                  auVar242._16_4_ = 0xc2b0c0a5;
                  auVar242._20_4_ = 0xc2b0c0a5;
                  auVar242._24_4_ = 0xc2b0c0a5;
                  auVar242._28_4_ = 0xc2b0c0a5;
                  auVar138 = vmaxps_avx(auVar142,auVar242);
                  auVar243._8_4_ = 0x3fb8aa3b;
                  auVar243._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar243._12_4_ = 0x3fb8aa3b;
                  auVar243._16_4_ = 0x3fb8aa3b;
                  auVar243._20_4_ = 0x3fb8aa3b;
                  auVar243._24_4_ = 0x3fb8aa3b;
                  auVar243._28_4_ = 0x3fb8aa3b;
                  auVar231 = vfmadd213ps_fma(auVar243,auVar138,auVar220);
                  auVar209 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar142 = vcmpps_avx(ZEXT1632(auVar231),auVar209,1);
                  auVar142 = vandps_avx(auVar142,auVar144);
                  auVar142 = vsubps_avx(auVar209,auVar142);
                  auVar231 = vfmsub231ps_fma(auVar138,auVar142,auVar367);
                  auVar397 = vfnmsub231ps_fma(ZEXT1632(auVar231),auVar142,auVar447);
                  auVar138 = ZEXT1632(auVar397);
                  auVar28._28_4_ = auVar209._28_4_;
                  auVar28._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar412._8_4_ = 0x39506967;
                  auVar412._0_8_ = 0x3950696739506967;
                  auVar412._12_4_ = 0x39506967;
                  auVar412._16_4_ = 0x39506967;
                  auVar412._20_4_ = 0x39506967;
                  auVar412._24_4_ = 0x39506967;
                  auVar412._28_4_ = 0x39506967;
                  auVar388 = ZEXT864(0) << 0x20;
                  auVar435._8_4_ = 0x3ab743ce;
                  auVar435._0_8_ = 0x3ab743ce3ab743ce;
                  auVar435._12_4_ = 0x3ab743ce;
                  auVar435._16_4_ = 0x3ab743ce;
                  auVar435._20_4_ = 0x3ab743ce;
                  auVar435._24_4_ = 0x3ab743ce;
                  auVar435._28_4_ = 0x3ab743ce;
                  auVar231 = vfmadd213ps_fma(auVar412,auVar138,auVar435);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar452);
                  auVar341 = ZEXT3264(auVar144);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar456);
                  auVar138 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar395);
                  auVar396 = ZEXT3264(auVar220);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar138,auVar220);
                  auVar350 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar28,auVar138);
                  auVar231._0_4_ = (int)auVar142._0_4_;
                  auVar231._4_4_ = (int)auVar142._4_4_;
                  auVar231._8_4_ = (int)auVar142._8_4_;
                  auVar231._12_4_ = (int)auVar142._12_4_;
                  auVar200._16_4_ = (int)auVar142._16_4_;
                  auVar200._0_16_ = auVar231;
                  auVar200._20_4_ = (int)auVar142._20_4_;
                  auVar200._24_4_ = (int)auVar142._24_4_;
                  auVar200._28_4_ = (int)auVar142._28_4_;
                  auVar397 = vpslld_avx(auVar231,0x17);
                  auVar231 = vpslld_avx(auVar200._16_16_,0x17);
                  auVar231 = vpaddd_avx(auVar231,auVar128);
                  auVar397 = vpaddd_avx(auVar397,auVar128);
                  auVar201._16_16_ = auVar231;
                  auVar201._0_16_ = auVar397;
                  auVar244._0_4_ = auVar350._0_4_ + fVar70;
                  auVar244._4_4_ = auVar350._4_4_ + fVar69;
                  auVar244._8_4_ = auVar350._8_4_ + fVar486;
                  auVar244._12_4_ = auVar350._12_4_ + fVar229;
                  auVar244._16_4_ = fVar230 + 0.0;
                  auVar244._20_4_ = fVar24 + 0.0;
                  auVar244._24_4_ = fVar155 + 0.0;
                  auVar244._28_4_ = fVar25 + 0.0;
                  auVar231 = vfmadd213ps_fma(auVar201,auVar244,auVar144);
                  auVar142 = vrcpps_avx(ZEXT1632(auVar231));
                  auVar231 = vfmsub213ps_fma(ZEXT1632(auVar231),auVar142,auVar144);
                  auVar231 = vfnmadd132ps_fma(ZEXT1632(auVar231),auVar142,auVar142);
                  auVar231 = vfnmadd213ps_fma(ZEXT1632(auVar231),auVar478,auVar148);
                  auVar195 = ZEXT1628(auVar231);
                  goto LAB_002a3c9e;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar207._4_4_ = uVar1;
                  auVar207._0_4_ = uVar1;
                  auVar207._8_4_ = uVar1;
                  auVar207._12_4_ = uVar1;
                  auVar207._16_4_ = uVar1;
                  auVar207._20_4_ = uVar1;
                  auVar207._24_4_ = uVar1;
                  auVar207._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar247._4_4_ = uVar1;
                  auVar247._0_4_ = uVar1;
                  auVar247._8_4_ = uVar1;
                  auVar247._12_4_ = uVar1;
                  auVar247._16_4_ = uVar1;
                  auVar247._20_4_ = uVar1;
                  auVar247._24_4_ = uVar1;
                  auVar247._28_4_ = uVar1;
                  auVar231 = vfmadd231ps_fma(auVar247,auVar142,auVar207);
                  auVar142 = vmaxps_avx(auVar138,ZEXT1632(auVar231));
                  auVar142 = vminps_avx(auVar142,auVar144);
                  auVar195 = auVar142._0_28_;
LAB_002a3c9e:
                  auVar459._0_4_ = auVar195._0_4_ * auVar153._0_4_;
                  auVar459._4_4_ = auVar195._4_4_ * auVar153._4_4_;
                  auVar459._8_4_ = auVar195._8_4_ * auVar153._8_4_;
                  auVar459._12_4_ = auVar195._12_4_ * auVar153._12_4_;
                  auVar459._16_4_ = auVar195._16_4_ * auVar153._16_4_;
                  auVar459._20_4_ = auVar195._20_4_ * auVar153._20_4_;
                  auVar459._24_4_ = auVar195._24_4_ * auVar153._24_4_;
                  auVar142 = auVar459._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var54 = auVar142;
                ppp_Var54 = ppp_Var54 + 4;
                uVar56 = uVar56 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar56 != local_a8.w);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != local_a8.h);
        }
        local_158 = local_158 + 1;
      } while (local_158 != local_a8.c);
      goto LAB_002a3d00;
    }
LAB_002a59b2:
    pp_Var58 = this->_vptr_Deconvolution_x86_fma;
  }
  else {
LAB_002a3d00:
    if ((uVar8 == 4) && (local_134 == 8)) {
      if ((long)local_a8.c < 1) goto LAB_002a59b2;
      p_Var48 = pp_Var58[-3];
      iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar56 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_198 = 0;
      auVar396 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar341 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar153 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar388 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar459 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_a8.h) {
          iVar52 = bottom_blob->w;
          iVar65 = bottom_blob->h;
          ppp_Var54 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar14 = bottom_blob->c;
          iVar49 = 0;
          do {
            if (0 < local_a8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar50) * iVar63;
              do {
                if (lVar59 == 0) {
                  auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar154 = ZEXT3264(*(undefined1 (*) [32])(lVar59 + local_198 * 0x20));
                }
                if (0 < (int)uVar14) {
                  pvVar68 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar56) {
                      uVar55 = 0;
                      uVar57 = 0;
                      do {
                        iVar40 = (((int)uVar57 - uVar56) + 1) * iVar9 + iVar49;
                        if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar10, iVar40 % iVar10 == 0)) &&
                            (0 < (int)uVar50)) && (iVar41 < iVar65)) {
                          lVar47 = (long)iVar41 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar53;
                          uVar61 = (ulong)uVar50;
                          uVar66 = uVar55;
                          iVar40 = iVar64;
                          do {
                            if (((-1 < iVar40) && (iVar41 = iVar40 / iVar67, iVar40 % iVar67 == 0))
                               && (iVar41 < iVar52)) {
                              lVar45 = (long)(iVar41 << 2);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47);
                              auVar208._4_4_ = uVar1;
                              auVar208._0_4_ = uVar1;
                              auVar208._8_4_ = uVar1;
                              auVar208._12_4_ = uVar1;
                              auVar208._16_4_ = uVar1;
                              auVar208._20_4_ = uVar1;
                              auVar208._24_4_ = uVar1;
                              auVar208._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 4);
                              auVar248._4_4_ = uVar1;
                              auVar248._0_4_ = uVar1;
                              auVar248._8_4_ = uVar1;
                              auVar248._12_4_ = uVar1;
                              auVar248._16_4_ = uVar1;
                              auVar248._20_4_ = uVar1;
                              auVar248._24_4_ = uVar1;
                              auVar248._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 8);
                              auVar336._4_4_ = uVar1;
                              auVar336._0_4_ = uVar1;
                              auVar336._8_4_ = uVar1;
                              auVar336._12_4_ = uVar1;
                              auVar336._16_4_ = uVar1;
                              auVar336._20_4_ = uVar1;
                              auVar336._24_4_ = uVar1;
                              auVar336._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0xc);
                              auVar414._4_4_ = uVar1;
                              auVar414._0_4_ = uVar1;
                              auVar414._8_4_ = uVar1;
                              auVar414._12_4_ = uVar1;
                              auVar414._16_4_ = uVar1;
                              auVar414._20_4_ = uVar1;
                              auVar414._24_4_ = uVar1;
                              auVar414._28_4_ = uVar1;
                              uVar46 = uVar66 & 0xffffffff;
                              auVar231 = vfmadd231ps_fma(auVar154._0_32_,auVar208,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar248,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x20));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar336,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x40));
                              auVar231 = vfmadd231ps_fma(ZEXT1632(auVar231),auVar414,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x60));
                              auVar154 = ZEXT1664(auVar231);
                            }
                            uVar66 = uVar66 + 0x20;
                            iVar40 = iVar40 + iVar63;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar57 = uVar57 + 1;
                        uVar55 = uVar55 + (ulong)uVar50 * 0x20;
                      } while (uVar57 != uVar56);
                    }
                    pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar50 * uVar56 * 0x20) * 4);
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar14);
                }
                auVar148 = auVar154._0_32_;
                auVar142 = auVar388._0_32_;
                auVar220 = auVar459._0_32_;
                auVar456 = auVar341._0_32_;
                auVar144 = auVar396._0_32_;
                auVar138 = auVar153._0_32_;
                auVar453._28_36_ = auVar154._28_36_;
                fVar70 = auVar388._0_4_;
                fVar69 = auVar388._4_4_;
                fVar486 = auVar388._8_4_;
                fVar229 = auVar388._12_4_;
                fVar230 = auVar388._16_4_;
                fVar24 = auVar388._20_4_;
                fVar155 = auVar388._24_4_;
                fVar25 = auVar388._28_4_;
                switch(uVar13) {
                case 1:
                  auVar148 = vmaxps_avx(auVar148,_DAT_0051a220);
                  break;
                case 2:
                  auVar456 = vmaxps_avx(auVar148,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar148 = vminps_avx(auVar148,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar147._4_4_ = uVar1;
                  auVar147._0_4_ = uVar1;
                  auVar147._8_4_ = uVar1;
                  auVar147._12_4_ = uVar1;
                  auVar147._16_4_ = uVar1;
                  auVar147._20_4_ = uVar1;
                  auVar147._24_4_ = uVar1;
                  auVar147._28_4_ = uVar1;
                  auVar231 = vfmadd213ps_fma(auVar147,auVar148,auVar456);
                  auVar148 = ZEXT1632(auVar231);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar216._4_4_ = uVar1;
                  auVar216._0_4_ = uVar1;
                  auVar216._8_4_ = uVar1;
                  auVar216._12_4_ = uVar1;
                  auVar216._16_4_ = uVar1;
                  auVar216._20_4_ = uVar1;
                  auVar216._24_4_ = uVar1;
                  auVar216._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar481._4_4_ = uVar1;
                  auVar481._0_4_ = uVar1;
                  auVar481._8_4_ = uVar1;
                  auVar481._12_4_ = uVar1;
                  auVar481._16_4_ = uVar1;
                  auVar481._20_4_ = uVar1;
                  auVar481._24_4_ = uVar1;
                  auVar481._28_4_ = uVar1;
                  auVar148 = vmaxps_avx(auVar148,auVar216);
                  auVar148 = vminps_avx(auVar481,auVar148);
                  break;
                case 4:
                  auVar143._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
                  auVar143._8_4_ = -auVar154._8_4_;
                  auVar143._12_4_ = -auVar154._12_4_;
                  auVar143._16_4_ = -auVar154._16_4_;
                  auVar143._20_4_ = -auVar154._20_4_;
                  auVar143._24_4_ = -auVar154._24_4_;
                  auVar143._28_4_ = auVar154._28_4_ ^ 0x80000000;
                  auVar97._8_4_ = 0x42b0c0a5;
                  auVar97._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar97._12_4_ = 0x42b0c0a5;
                  auVar97._16_4_ = 0x42b0c0a5;
                  auVar97._20_4_ = 0x42b0c0a5;
                  auVar97._24_4_ = 0x42b0c0a5;
                  auVar97._28_4_ = 0x42b0c0a5;
                  auVar148 = vminps_avx(auVar143,auVar97);
                  auVar144 = vmaxps_avx(auVar144,auVar148);
                  auVar231 = vfmadd213ps_fma(auVar138,auVar144,auVar456);
                  auVar138 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar231),auVar138,1);
                  auVar148 = vandps_avx(auVar148,auVar142);
                  auVar148 = vsubps_avx(auVar138,auVar148);
                  auVar98._8_4_ = 0x3f318000;
                  auVar98._0_8_ = 0x3f3180003f318000;
                  auVar98._12_4_ = 0x3f318000;
                  auVar98._16_4_ = 0x3f318000;
                  auVar98._20_4_ = 0x3f318000;
                  auVar98._24_4_ = 0x3f318000;
                  auVar98._28_4_ = 0x3f318000;
                  auVar231 = vfmsub231ps_fma(auVar144,auVar148,auVar98);
                  auVar253._8_4_ = 0x395e8083;
                  auVar253._0_8_ = 0x395e8083395e8083;
                  auVar253._12_4_ = 0x395e8083;
                  auVar253._16_4_ = 0x395e8083;
                  auVar253._20_4_ = 0x395e8083;
                  auVar253._24_4_ = 0x395e8083;
                  auVar253._28_4_ = 0x395e8083;
                  auVar397 = vfmsub231ps_fma(ZEXT1632(auVar231),auVar148,auVar253);
                  auVar144 = ZEXT1632(auVar397);
                  auVar33._28_4_ = auVar138._28_4_;
                  auVar33._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar99._8_4_ = 0x3ab743ce;
                  auVar99._0_8_ = 0x3ab743ce3ab743ce;
                  auVar99._12_4_ = 0x3ab743ce;
                  auVar99._16_4_ = 0x3ab743ce;
                  auVar99._20_4_ = 0x3ab743ce;
                  auVar99._24_4_ = 0x3ab743ce;
                  auVar99._28_4_ = 0x3ab743ce;
                  auVar231 = vfmadd213ps_fma(auVar220,auVar144,auVar99);
                  auVar254._8_4_ = 0x3c088908;
                  auVar254._0_8_ = 0x3c0889083c088908;
                  auVar254._12_4_ = 0x3c088908;
                  auVar254._16_4_ = 0x3c088908;
                  auVar254._20_4_ = 0x3c088908;
                  auVar254._24_4_ = 0x3c088908;
                  auVar254._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar254);
                  auVar255._8_4_ = 0x3d2aa9c1;
                  auVar255._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar255._12_4_ = 0x3d2aa9c1;
                  auVar255._16_4_ = 0x3d2aa9c1;
                  auVar255._20_4_ = 0x3d2aa9c1;
                  auVar255._24_4_ = 0x3d2aa9c1;
                  auVar255._28_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar255);
                  auVar100._8_4_ = 0x3e2aaaaa;
                  auVar100._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar100._12_4_ = 0x3e2aaaaa;
                  auVar100._16_4_ = 0x3e2aaaaa;
                  auVar100._20_4_ = 0x3e2aaaaa;
                  auVar100._24_4_ = 0x3e2aaaaa;
                  auVar100._28_4_ = 0x3e2aaaaa;
                  auVar144 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar100);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar456);
                  auVar350 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar33,auVar144);
                  auVar113._0_4_ = (int)auVar148._0_4_;
                  auVar113._4_4_ = (int)auVar148._4_4_;
                  auVar113._8_4_ = (int)auVar148._8_4_;
                  auVar113._12_4_ = (int)auVar148._12_4_;
                  auVar145._16_4_ = (int)auVar148._16_4_;
                  auVar145._0_16_ = auVar113;
                  auVar145._20_4_ = (int)auVar148._20_4_;
                  auVar145._24_4_ = (int)auVar148._24_4_;
                  auVar145._28_4_ = (int)auVar148._28_4_;
                  auVar397 = vpslld_avx(auVar113,0x17);
                  auVar231 = vpslld_avx(auVar145._16_16_,0x17);
                  auVar73._8_4_ = 0x3f800000;
                  auVar73._0_8_ = 0x3f8000003f800000;
                  auVar73._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar231,auVar73);
                  auVar397 = vpaddd_avx(auVar397,auVar73);
                  auVar146._16_16_ = auVar231;
                  auVar146._0_16_ = auVar397;
                  auVar217._0_4_ = auVar350._0_4_ + fVar70;
                  auVar217._4_4_ = auVar350._4_4_ + fVar69;
                  auVar217._8_4_ = auVar350._8_4_ + fVar486;
                  auVar217._12_4_ = auVar350._12_4_ + fVar229;
                  auVar217._16_4_ = fVar230 + 0.0;
                  auVar217._20_4_ = fVar24 + 0.0;
                  auVar217._24_4_ = fVar155 + 0.0;
                  auVar217._28_4_ = fVar25 + 0.0;
                  auVar231 = vfmadd213ps_fma(auVar146,auVar217,auVar142);
                  auVar148 = vrcpps_avx(ZEXT1632(auVar231));
                  auVar231 = vfmsub213ps_fma(ZEXT1632(auVar231),auVar148,auVar142);
                  auVar231 = vfnmadd132ps_fma(ZEXT1632(auVar231),auVar148,auVar148);
                  auVar148 = ZEXT1632(auVar231);
                  break;
                case 5:
                  auVar436._8_4_ = 0x42b0c0a5;
                  auVar436._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar436._12_4_ = 0x42b0c0a5;
                  auVar436._16_4_ = 0x42b0c0a5;
                  auVar436._20_4_ = 0x42b0c0a5;
                  auVar436._24_4_ = 0x42b0c0a5;
                  auVar436._28_4_ = 0x42b0c0a5;
                  auVar148 = vminps_avx(auVar436,auVar148);
                  auVar209 = vmaxps_avx(auVar144,auVar148);
                  auVar231 = vfmadd213ps_fma(auVar138,auVar209,auVar456);
                  auVar445 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar231),auVar445,1);
                  auVar148 = vandps_avx(auVar148,auVar142);
                  auVar148 = vsubps_avx(auVar445,auVar148);
                  auVar345._8_4_ = 0x3f318000;
                  auVar345._0_8_ = 0x3f3180003f318000;
                  auVar345._12_4_ = 0x3f318000;
                  auVar345._16_4_ = 0x3f318000;
                  auVar345._20_4_ = 0x3f318000;
                  auVar345._24_4_ = 0x3f318000;
                  auVar345._28_4_ = 0x3f318000;
                  auVar231 = vfmsub231ps_fma(auVar209,auVar148,auVar345);
                  auVar94._8_4_ = 0xb95e8083;
                  auVar94._0_8_ = 0xb95e8083b95e8083;
                  auVar94._12_4_ = 0xb95e8083;
                  auVar94._16_4_ = 0xb95e8083;
                  auVar94._20_4_ = 0xb95e8083;
                  auVar94._24_4_ = 0xb95e8083;
                  auVar94._28_4_ = 0xb95e8083;
                  auVar397 = vfnmsub231ps_fma(ZEXT1632(auVar231),auVar148,auVar94);
                  auVar209 = ZEXT1632(auVar397);
                  auVar30._28_4_ = auVar445._28_4_;
                  auVar30._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar457._8_4_ = 0x3ab743ce;
                  auVar457._0_8_ = 0x3ab743ce3ab743ce;
                  auVar457._12_4_ = 0x3ab743ce;
                  auVar457._16_4_ = 0x3ab743ce;
                  auVar457._20_4_ = 0x3ab743ce;
                  auVar457._24_4_ = 0x3ab743ce;
                  auVar457._28_4_ = 0x3ab743ce;
                  auVar231 = vfmadd213ps_fma(auVar220,auVar209,auVar457);
                  auVar368._8_4_ = 0x3c088908;
                  auVar368._0_8_ = 0x3c0889083c088908;
                  auVar368._12_4_ = 0x3c088908;
                  auVar368._16_4_ = 0x3c088908;
                  auVar368._20_4_ = 0x3c088908;
                  auVar368._24_4_ = 0x3c088908;
                  auVar368._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar209,auVar368);
                  auVar319._8_4_ = 0x3d2aa9c1;
                  auVar319._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar319._12_4_ = 0x3d2aa9c1;
                  auVar319._16_4_ = 0x3d2aa9c1;
                  auVar319._20_4_ = 0x3d2aa9c1;
                  auVar319._24_4_ = 0x3d2aa9c1;
                  auVar319._28_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar209,auVar319);
                  auVar320._8_4_ = 0x3e2aaaaa;
                  auVar320._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar320._12_4_ = 0x3e2aaaaa;
                  auVar320._16_4_ = 0x3e2aaaaa;
                  auVar320._20_4_ = 0x3e2aaaaa;
                  auVar320._24_4_ = 0x3e2aaaaa;
                  auVar320._28_4_ = 0x3e2aaaaa;
                  auVar209 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar209,auVar320);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar209,auVar456);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar30,auVar209);
                  auVar210._0_4_ = auVar231._0_4_ + fVar70;
                  auVar210._4_4_ = auVar231._4_4_ + fVar69;
                  auVar210._8_4_ = auVar231._8_4_ + fVar486;
                  auVar210._12_4_ = auVar231._12_4_ + fVar229;
                  auVar210._16_4_ = fVar230 + 0.0;
                  auVar210._20_4_ = fVar24 + 0.0;
                  auVar210._24_4_ = fVar155 + 0.0;
                  auVar210._28_4_ = fVar25 + 0.0;
                  auVar350._0_4_ = (int)auVar148._0_4_;
                  auVar350._4_4_ = (int)auVar148._4_4_;
                  auVar350._8_4_ = (int)auVar148._8_4_;
                  auVar350._12_4_ = (int)auVar148._12_4_;
                  auVar249._16_4_ = (int)auVar148._16_4_;
                  auVar249._0_16_ = auVar350;
                  auVar249._20_4_ = (int)auVar148._20_4_;
                  auVar249._24_4_ = (int)auVar148._24_4_;
                  auVar249._28_4_ = (int)auVar148._28_4_;
                  auVar397 = vpslld_avx(auVar350,0x17);
                  auVar231 = vpslld_avx(auVar249._16_16_,0x17);
                  auVar347._8_4_ = 0x3f800000;
                  auVar347._0_8_ = 0x3f8000003f800000;
                  auVar347._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar347,auVar231);
                  auVar397 = vpaddd_avx(auVar397,auVar347);
                  auVar480._16_16_ = auVar231;
                  auVar480._0_16_ = auVar397;
                  auVar350 = vfmadd213ps_fma(auVar480,auVar210,auVar142);
                  auVar211._8_4_ = 0x800000;
                  auVar211._0_8_ = 0x80000000800000;
                  auVar211._12_4_ = 0x800000;
                  auVar211._16_4_ = 0x800000;
                  auVar211._20_4_ = 0x800000;
                  auVar211._24_4_ = 0x800000;
                  auVar211._28_4_ = 0x800000;
                  auVar148 = vmaxps_avx(ZEXT1632(auVar350),auVar211);
                  auVar397 = vpsrld_avx(auVar148._0_16_,0x17);
                  auVar231 = vpsrld_avx(auVar148._16_16_,0x17);
                  auVar321._8_4_ = 0x807fffff;
                  auVar321._0_8_ = 0x807fffff807fffff;
                  auVar321._12_4_ = 0x807fffff;
                  auVar321._16_4_ = 0x807fffff;
                  auVar321._20_4_ = 0x807fffff;
                  auVar321._24_4_ = 0x807fffff;
                  auVar321._28_4_ = 0x807fffff;
                  auVar148 = vandps_avx(auVar148,auVar321);
                  auVar445 = vorps_avx(auVar148,auVar456);
                  auVar322._8_4_ = 0x3f3504f3;
                  auVar322._0_8_ = 0x3f3504f33f3504f3;
                  auVar322._12_4_ = 0x3f3504f3;
                  auVar322._16_4_ = 0x3f3504f3;
                  auVar322._20_4_ = 0x3f3504f3;
                  auVar322._24_4_ = 0x3f3504f3;
                  auVar322._28_4_ = 0x3f3504f3;
                  auVar209 = vcmpps_avx(auVar322,auVar445,2);
                  auVar148 = vandnps_avx(auVar209,auVar445);
                  auVar212._0_4_ = auVar148._0_4_ + auVar445._0_4_ + -1.0;
                  auVar212._4_4_ = auVar148._4_4_ + auVar445._4_4_ + -1.0;
                  auVar212._8_4_ = auVar148._8_4_ + auVar445._8_4_ + -1.0;
                  auVar212._12_4_ = auVar148._12_4_ + auVar445._12_4_ + -1.0;
                  auVar212._16_4_ = auVar148._16_4_ + auVar445._16_4_ + -1.0;
                  auVar212._20_4_ = auVar148._20_4_ + auVar445._20_4_ + -1.0;
                  auVar212._24_4_ = auVar148._24_4_ + auVar445._24_4_ + -1.0;
                  auVar212._28_4_ = auVar148._28_4_ + auVar445._28_4_ + -1.0;
                  auVar231 = vpsubd_avx(auVar231,auVar209._16_16_);
                  auVar420._8_4_ = 0xffffff81;
                  auVar420._0_8_ = 0xffffff81ffffff81;
                  auVar420._12_4_ = 0xffffff81;
                  auVar231 = vpaddd_avx(auVar231,auVar420);
                  auVar397 = vpsubd_avx(auVar397,auVar209._0_16_);
                  auVar397 = vpaddd_avx(auVar420,auVar397);
                  auVar250._16_16_ = auVar231;
                  auVar250._0_16_ = auVar397;
                  auVar31._4_4_ = auVar212._4_4_ * auVar212._4_4_;
                  auVar31._0_4_ = auVar212._0_4_ * auVar212._0_4_;
                  auVar31._8_4_ = auVar212._8_4_ * auVar212._8_4_;
                  auVar31._12_4_ = auVar212._12_4_ * auVar212._12_4_;
                  auVar31._16_4_ = auVar212._16_4_ * auVar212._16_4_;
                  auVar31._20_4_ = auVar212._20_4_ * auVar212._20_4_;
                  auVar31._24_4_ = auVar212._24_4_ * auVar212._24_4_;
                  auVar31._28_4_ = auVar209._28_4_;
                  auVar415._8_4_ = 0x3d9021bb;
                  auVar415._0_8_ = 0x3d9021bb3d9021bb;
                  auVar415._12_4_ = 0x3d9021bb;
                  auVar415._16_4_ = 0x3d9021bb;
                  auVar415._20_4_ = 0x3d9021bb;
                  auVar415._24_4_ = 0x3d9021bb;
                  auVar415._28_4_ = 0x3d9021bb;
                  auVar369._8_4_ = 0xbdebd1b8;
                  auVar369._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar369._12_4_ = 0xbdebd1b8;
                  auVar369._16_4_ = 0xbdebd1b8;
                  auVar369._20_4_ = 0xbdebd1b8;
                  auVar369._24_4_ = 0xbdebd1b8;
                  auVar369._28_4_ = 0xbdebd1b8;
                  auVar231 = vfmadd213ps_fma(auVar415,auVar212,auVar369);
                  auVar370._8_4_ = 0x3def251a;
                  auVar370._0_8_ = 0x3def251a3def251a;
                  auVar370._12_4_ = 0x3def251a;
                  auVar370._16_4_ = 0x3def251a;
                  auVar370._20_4_ = 0x3def251a;
                  auVar370._24_4_ = 0x3def251a;
                  auVar370._28_4_ = 0x3def251a;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar212,auVar370);
                  auVar371._8_4_ = 0xbdfe5d4f;
                  auVar371._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar371._12_4_ = 0xbdfe5d4f;
                  auVar371._16_4_ = 0xbdfe5d4f;
                  auVar371._20_4_ = 0xbdfe5d4f;
                  auVar371._24_4_ = 0xbdfe5d4f;
                  auVar371._28_4_ = 0xbdfe5d4f;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar212,auVar371);
                  auVar372._8_4_ = 0x3e11e9bf;
                  auVar372._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar372._12_4_ = 0x3e11e9bf;
                  auVar372._16_4_ = 0x3e11e9bf;
                  auVar372._20_4_ = 0x3e11e9bf;
                  auVar372._24_4_ = 0x3e11e9bf;
                  auVar372._28_4_ = 0x3e11e9bf;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar212,auVar372);
                  auVar373._8_4_ = 0xbe2aae50;
                  auVar373._0_8_ = 0xbe2aae50be2aae50;
                  auVar373._12_4_ = 0xbe2aae50;
                  auVar373._16_4_ = 0xbe2aae50;
                  auVar373._20_4_ = 0xbe2aae50;
                  auVar373._24_4_ = 0xbe2aae50;
                  auVar373._28_4_ = 0xbe2aae50;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar212,auVar373);
                  auVar374._8_4_ = 0x3e4cceac;
                  auVar374._0_8_ = 0x3e4cceac3e4cceac;
                  auVar374._12_4_ = 0x3e4cceac;
                  auVar374._16_4_ = 0x3e4cceac;
                  auVar374._20_4_ = 0x3e4cceac;
                  auVar374._24_4_ = 0x3e4cceac;
                  auVar374._28_4_ = 0x3e4cceac;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar212,auVar374);
                  auVar375._8_4_ = 0xbe7ffffc;
                  auVar375._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar375._12_4_ = 0xbe7ffffc;
                  auVar375._16_4_ = 0xbe7ffffc;
                  auVar375._20_4_ = 0xbe7ffffc;
                  auVar375._24_4_ = 0xbe7ffffc;
                  auVar375._28_4_ = 0xbe7ffffc;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar212,auVar375);
                  auVar376._8_4_ = 0x3eaaaaaa;
                  auVar376._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar376._12_4_ = 0x3eaaaaaa;
                  auVar376._16_4_ = 0x3eaaaaaa;
                  auVar376._20_4_ = 0x3eaaaaaa;
                  auVar376._24_4_ = 0x3eaaaaaa;
                  auVar376._28_4_ = 0x3eaaaaaa;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar212,auVar376);
                  auVar416._0_4_ = auVar212._0_4_ * auVar212._0_4_ * auVar212._0_4_ * auVar231._0_4_
                  ;
                  auVar416._4_4_ = auVar212._4_4_ * auVar212._4_4_ * auVar212._4_4_ * auVar231._4_4_
                  ;
                  auVar416._8_4_ = auVar212._8_4_ * auVar212._8_4_ * auVar212._8_4_ * auVar231._8_4_
                  ;
                  auVar416._12_4_ =
                       auVar212._12_4_ * auVar212._12_4_ * auVar212._12_4_ * auVar231._12_4_;
                  auVar416._16_4_ = auVar212._16_4_ * auVar212._16_4_ * auVar212._16_4_ * 0.0;
                  auVar416._20_4_ = auVar212._20_4_ * auVar212._20_4_ * auVar212._20_4_ * 0.0;
                  auVar416._24_4_ = auVar212._24_4_ * auVar212._24_4_ * auVar212._24_4_ * 0.0;
                  auVar416._28_4_ = 0;
                  auVar209 = vcvtdq2ps_avx(auVar250);
                  auVar437._8_4_ = 0xb95e8083;
                  auVar437._0_8_ = 0xb95e8083b95e8083;
                  auVar437._12_4_ = 0xb95e8083;
                  auVar437._16_4_ = 0xb95e8083;
                  auVar437._20_4_ = 0xb95e8083;
                  auVar437._24_4_ = 0xb95e8083;
                  auVar437._28_4_ = 0xb95e8083;
                  auVar231 = vfmadd231ps_fma(auVar416,auVar209,auVar437);
                  auVar231 = vfmsub231ps_fma(ZEXT1632(auVar231),auVar456,auVar31);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar350),ZEXT832(0) << 0x20,2);
                  auVar445 = vsubps_avx(ZEXT1632(auVar231),auVar212);
                  auVar231 = vfmsub231ps_fma(auVar445,auVar345,auVar209);
                  auVar377._8_4_ = 0xc0000000;
                  auVar377._0_8_ = 0xc0000000c0000000;
                  auVar377._12_4_ = 0xc0000000;
                  auVar377._16_4_ = 0xc0000000;
                  auVar377._20_4_ = 0xc0000000;
                  auVar377._24_4_ = 0xc0000000;
                  auVar377._28_4_ = 0xc0000000;
                  auVar213._0_4_ = auVar231._0_4_ * -2.0;
                  auVar213._4_4_ = auVar231._4_4_ * -2.0;
                  auVar213._8_4_ = auVar231._8_4_ * -2.0;
                  auVar213._12_4_ = auVar231._12_4_ * -2.0;
                  auVar213._16_4_ = 0x80000000;
                  auVar213._20_4_ = 0x80000000;
                  auVar213._24_4_ = 0x80000000;
                  auVar213._28_4_ = 0;
                  auVar251._8_4_ = 0x7fffffff;
                  auVar251._0_8_ = 0x7fffffff7fffffff;
                  auVar251._12_4_ = 0x7fffffff;
                  auVar251._16_4_ = 0x7fffffff;
                  auVar251._20_4_ = 0x7fffffff;
                  auVar251._24_4_ = 0x7fffffff;
                  auVar251._28_4_ = 0x7fffffff;
                  auVar148 = vblendvps_avx(auVar213,auVar251,auVar148);
                  auVar148 = vminps_avx(auVar436,auVar148);
                  auVar396 = ZEXT3264(auVar144);
                  auVar144 = vmaxps_avx(auVar144,auVar148);
                  auVar153 = ZEXT3264(auVar138);
                  auVar231 = vfmadd213ps_fma(auVar138,auVar144,auVar456);
                  auVar138 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar231),auVar138,1);
                  auVar148 = vandps_avx(auVar148,auVar142);
                  auVar148 = vsubps_avx(auVar138,auVar148);
                  auVar231 = vfmsub231ps_fma(auVar144,auVar148,auVar345);
                  auVar397 = vfnmsub231ps_fma(ZEXT1632(auVar231),auVar148,auVar437);
                  auVar144 = ZEXT1632(auVar397);
                  auVar32._28_4_ = auVar138._28_4_;
                  auVar32._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar459 = ZEXT3264(auVar220);
                  auVar231 = vfmadd213ps_fma(auVar220,auVar144,auVar457);
                  auVar323._8_4_ = 0x3c088908;
                  auVar323._0_8_ = 0x3c0889083c088908;
                  auVar323._12_4_ = 0x3c088908;
                  auVar323._16_4_ = 0x3c088908;
                  auVar323._20_4_ = 0x3c088908;
                  auVar323._24_4_ = 0x3c088908;
                  auVar323._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar323);
                  auVar324._8_4_ = 0x3d2aa9c1;
                  auVar324._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar324._12_4_ = 0x3d2aa9c1;
                  auVar324._16_4_ = 0x3d2aa9c1;
                  auVar324._20_4_ = 0x3d2aa9c1;
                  auVar324._24_4_ = 0x3d2aa9c1;
                  auVar324._28_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar324);
                  auVar341 = ZEXT3264(auVar456);
                  auVar388 = ZEXT3264(auVar142);
                  auVar95._8_4_ = 0x3e2aaaaa;
                  auVar95._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar95._12_4_ = 0x3e2aaaaa;
                  auVar95._16_4_ = 0x3e2aaaaa;
                  auVar95._20_4_ = 0x3e2aaaaa;
                  auVar95._24_4_ = 0x3e2aaaaa;
                  auVar95._28_4_ = 0x3e2aaaaa;
                  auVar144 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar95);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar144,auVar456);
                  auVar350 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar32,auVar144);
                  auVar364._0_4_ = (int)auVar148._0_4_;
                  auVar364._4_4_ = (int)auVar148._4_4_;
                  auVar364._8_4_ = (int)auVar148._8_4_;
                  auVar364._12_4_ = (int)auVar148._12_4_;
                  auVar214._16_4_ = (int)auVar148._16_4_;
                  auVar214._0_16_ = auVar364;
                  auVar214._20_4_ = (int)auVar148._20_4_;
                  auVar214._24_4_ = (int)auVar148._24_4_;
                  auVar214._28_4_ = (int)auVar148._28_4_;
                  auVar397 = vpslld_avx(auVar364,0x17);
                  auVar231 = vpslld_avx(auVar214._16_16_,0x17);
                  auVar72._8_4_ = 0x3f800000;
                  auVar72._0_8_ = 0x3f8000003f800000;
                  auVar72._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar231,auVar72);
                  auVar397 = vpaddd_avx(auVar397,auVar72);
                  auVar215._16_16_ = auVar231;
                  auVar215._0_16_ = auVar397;
                  auVar252._0_4_ = auVar350._0_4_ + fVar70;
                  auVar252._4_4_ = auVar350._4_4_ + fVar69;
                  auVar252._8_4_ = auVar350._8_4_ + fVar486;
                  auVar252._12_4_ = auVar350._12_4_ + fVar229;
                  auVar252._16_4_ = fVar230 + 0.0;
                  auVar252._20_4_ = fVar24 + 0.0;
                  auVar252._24_4_ = fVar155 + 0.0;
                  auVar252._28_4_ = fVar25 + 0.0;
                  auVar231 = vfmadd213ps_fma(auVar215,auVar252,auVar142);
                  auVar148 = vrcpps_avx(ZEXT1632(auVar231));
                  auVar231 = vfmsub213ps_fma(ZEXT1632(auVar231),auVar148,auVar142);
                  auVar231 = vfnmadd132ps_fma(ZEXT1632(auVar231),auVar148,auVar148);
                  auVar96._8_4_ = 0xbf800000;
                  auVar96._0_8_ = 0xbf800000bf800000;
                  auVar96._12_4_ = 0xbf800000;
                  auVar96._16_4_ = 0xbf800000;
                  auVar96._20_4_ = 0xbf800000;
                  auVar96._24_4_ = 0xbf800000;
                  auVar96._28_4_ = 0xbf800000;
                  auVar231 = vfnmadd213ps_fma(ZEXT1632(auVar231),auVar377,auVar96);
                  auVar195 = ZEXT1628(auVar231);
                  goto LAB_002a44ce;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar218._4_4_ = uVar1;
                  auVar218._0_4_ = uVar1;
                  auVar218._8_4_ = uVar1;
                  auVar218._12_4_ = uVar1;
                  auVar218._16_4_ = uVar1;
                  auVar218._20_4_ = uVar1;
                  auVar218._24_4_ = uVar1;
                  auVar218._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar256._4_4_ = uVar1;
                  auVar256._0_4_ = uVar1;
                  auVar256._8_4_ = uVar1;
                  auVar256._12_4_ = uVar1;
                  auVar256._16_4_ = uVar1;
                  auVar256._20_4_ = uVar1;
                  auVar256._24_4_ = uVar1;
                  auVar256._28_4_ = uVar1;
                  auVar231 = vfmadd231ps_fma(auVar256,auVar148,auVar218);
                  auVar148 = vmaxps_avx(ZEXT1632(auVar231),_DAT_0051a220);
                  auVar148 = vminps_avx(auVar148,auVar142);
                  auVar195 = auVar148._0_28_;
LAB_002a44ce:
                  auVar453._0_4_ = auVar195._0_4_ * auVar154._0_4_;
                  auVar453._4_4_ = auVar195._4_4_ * auVar154._4_4_;
                  auVar453._8_4_ = auVar195._8_4_ * auVar154._8_4_;
                  auVar453._12_4_ = auVar195._12_4_ * auVar154._12_4_;
                  auVar453._16_4_ = auVar195._16_4_ * auVar154._16_4_;
                  auVar453._20_4_ = auVar195._20_4_ * auVar154._20_4_;
                  auVar453._24_4_ = auVar195._24_4_ * auVar154._24_4_;
                  auVar148 = auVar453._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var54 = auVar148;
                ppp_Var54 = ppp_Var54 + 4;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_a8.w);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar8 == 8) && (local_134 == 4)) {
      if ((long)local_a8.c < 1) goto LAB_002a59b2;
      p_Var48 = pp_Var58[-3];
      iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar56 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_198 = 0;
      auVar388 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar326._8_4_ = 0x3f000000;
      auVar326._0_8_ = 0x3f0000003f000000;
      auVar326._12_4_ = 0x3f000000;
      auVar341 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar454._8_4_ = 0x3ab743ce;
      auVar454._0_8_ = 0x3ab743ce3ab743ce;
      auVar454._12_4_ = 0x3ab743ce;
      do {
        if (0 < local_a8.h) {
          iVar52 = bottom_blob->w;
          iVar65 = bottom_blob->h;
          ppp_Var54 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar14 = bottom_blob->c;
          iVar49 = 0;
          do {
            if (0 < local_a8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar50) * iVar63;
              do {
                if (lVar59 == 0) {
                  auVar114 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar114 = *(undefined1 (*) [16])(lVar59 + local_198 * 0x10);
                }
                auVar396 = ZEXT1664(auVar114);
                if (0 < (int)uVar14) {
                  pvVar68 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar56) {
                      uVar55 = 0;
                      uVar57 = 0;
                      do {
                        iVar40 = (((int)uVar57 - uVar56) + 1) * iVar9 + iVar49;
                        if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar10, iVar40 % iVar10 == 0)) &&
                            (0 < (int)uVar50)) && (iVar41 < iVar65)) {
                          lVar47 = (long)iVar41 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar53;
                          uVar61 = (ulong)uVar50;
                          uVar66 = uVar55;
                          iVar40 = iVar64;
                          do {
                            if (((-1 < iVar40) && (iVar41 = iVar40 / iVar67, iVar40 % iVar67 == 0))
                               && (iVar41 < iVar52)) {
                              lVar45 = (long)(iVar41 << 3);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47);
                              auVar156._4_4_ = uVar1;
                              auVar156._0_4_ = uVar1;
                              auVar156._8_4_ = uVar1;
                              auVar156._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 4);
                              auVar266._4_4_ = uVar1;
                              auVar266._0_4_ = uVar1;
                              auVar266._8_4_ = uVar1;
                              auVar266._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 8);
                              auVar348._4_4_ = uVar1;
                              auVar348._0_4_ = uVar1;
                              auVar348._8_4_ = uVar1;
                              auVar348._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0xc);
                              auVar389._4_4_ = uVar1;
                              auVar389._0_4_ = uVar1;
                              auVar389._8_4_ = uVar1;
                              auVar389._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x10);
                              auVar398._4_4_ = uVar1;
                              auVar398._0_4_ = uVar1;
                              auVar398._8_4_ = uVar1;
                              auVar398._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x14);
                              auVar461._4_4_ = uVar1;
                              auVar461._0_4_ = uVar1;
                              auVar461._8_4_ = uVar1;
                              auVar461._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x18);
                              auVar421._4_4_ = uVar1;
                              auVar421._0_4_ = uVar1;
                              auVar421._8_4_ = uVar1;
                              auVar421._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0x1c);
                              auVar440._4_4_ = uVar1;
                              auVar440._0_4_ = uVar1;
                              auVar440._8_4_ = uVar1;
                              auVar440._12_4_ = uVar1;
                              uVar46 = uVar66 & 0xffffffff;
                              auVar231 = vfmadd231ps_fma(auVar396._0_16_,auVar156,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar266,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x10));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar348,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x20));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar389,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x30));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar398,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x40));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar461,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x50));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar421,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x60));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar440,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x70));
                              auVar396 = ZEXT1664(auVar231);
                            }
                            uVar66 = uVar66 + 0x20;
                            iVar40 = iVar40 + iVar63;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar57 = uVar57 + 1;
                        uVar55 = uVar55 + (ulong)uVar50 * 0x20;
                      } while (uVar57 != uVar56);
                    }
                    auVar114 = auVar396._0_16_;
                    pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar50 * uVar56 * 0x20) * 4);
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar14);
                }
                auVar397 = auVar388._0_16_;
                auVar231 = auVar341._0_16_;
                fVar70 = auVar341._0_4_;
                fVar69 = auVar341._4_4_;
                fVar486 = auVar341._8_4_;
                fVar229 = auVar341._12_4_;
                fVar155 = auVar114._4_4_;
                fVar230 = auVar114._8_4_;
                fVar24 = auVar114._12_4_;
                switch(uVar13) {
                case 1:
                  auVar114 = vmaxps_avx(auVar114,auVar397);
                  break;
                case 2:
                  auVar231 = vmaxps_avx(auVar114,auVar397);
                  auVar397 = vminps_avx(auVar114,auVar397);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar117._4_4_ = uVar1;
                  auVar117._0_4_ = uVar1;
                  auVar117._8_4_ = uVar1;
                  auVar117._12_4_ = uVar1;
                  auVar114 = vfmadd213ps_fma(auVar117,auVar397,auVar231);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar354._4_4_ = uVar1;
                  auVar354._0_4_ = uVar1;
                  auVar354._8_4_ = uVar1;
                  auVar354._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar464._4_4_ = uVar1;
                  auVar464._0_4_ = uVar1;
                  auVar464._8_4_ = uVar1;
                  auVar464._12_4_ = uVar1;
                  auVar231 = vmaxps_avx(auVar354,auVar114);
                  auVar114 = vminps_avx(auVar464,auVar231);
                  break;
                case 4:
                  auVar115._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
                  auVar115._8_4_ = -fVar230;
                  auVar115._12_4_ = -fVar24;
                  auVar162._8_4_ = 0x42b0c0a5;
                  auVar162._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar162._12_4_ = 0x42b0c0a5;
                  auVar397 = vminps_avx(auVar115,auVar162);
                  auVar163._8_4_ = 0xc2b0c0a5;
                  auVar163._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar163._12_4_ = 0xc2b0c0a5;
                  auVar128 = vmaxps_avx(auVar397,auVar163);
                  auVar355._8_4_ = 0x3fb8aa3b;
                  auVar355._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar355._12_4_ = 0x3fb8aa3b;
                  auVar397 = vfmadd213ps_fma(auVar355,auVar128,auVar326);
                  auVar465._0_4_ = (int)auVar397._0_4_;
                  auVar465._4_4_ = (int)auVar397._4_4_;
                  auVar465._8_4_ = (int)auVar397._8_4_;
                  auVar465._12_4_ = (int)auVar397._12_4_;
                  auVar350 = vcvtdq2ps_avx(auVar465);
                  auVar397 = vcmpps_avx(auVar397,auVar350,1);
                  auVar397 = vandps_avx(auVar397,auVar231);
                  auVar397 = vsubps_avx(auVar350,auVar397);
                  auVar75._8_4_ = 0x3f318000;
                  auVar75._0_8_ = 0x3f3180003f318000;
                  auVar75._12_4_ = 0x3f318000;
                  auVar350 = vfmsub231ps_fma(auVar128,auVar397,auVar75);
                  auVar164._8_4_ = 0x395e8083;
                  auVar164._0_8_ = 0x395e8083395e8083;
                  auVar164._12_4_ = 0x395e8083;
                  auVar128 = vfmsub231ps_fma(auVar350,auVar397,auVar164);
                  auVar466._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                  auVar466._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                  auVar466._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                  auVar466._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                  auVar400._8_4_ = 0x39506967;
                  auVar400._0_8_ = 0x3950696739506967;
                  auVar400._12_4_ = 0x39506967;
                  auVar165._8_4_ = 0x3ab743ce;
                  auVar165._0_8_ = 0x3ab743ce3ab743ce;
                  auVar165._12_4_ = 0x3ab743ce;
                  auVar350 = vfmadd213ps_fma(auVar400,auVar128,auVar165);
                  auVar166._8_4_ = 0x3c088908;
                  auVar166._0_8_ = 0x3c0889083c088908;
                  auVar166._12_4_ = 0x3c088908;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar166);
                  auVar76._8_4_ = 0x3d2aa9c1;
                  auVar76._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar76._12_4_ = 0x3d2aa9c1;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar76);
                  auVar77._8_4_ = 0x3e2aaaaa;
                  auVar77._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar77._12_4_ = 0x3e2aaaaa;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar77);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar326);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar466,auVar128);
                  auVar401._0_4_ = auVar350._0_4_ + fVar70;
                  auVar401._4_4_ = auVar350._4_4_ + fVar69;
                  auVar401._8_4_ = auVar350._8_4_ + fVar486;
                  auVar401._12_4_ = auVar350._12_4_ + fVar229;
                  auVar116._0_4_ = (int)auVar397._0_4_;
                  auVar116._4_4_ = (int)auVar397._4_4_;
                  auVar116._8_4_ = (int)auVar397._8_4_;
                  auVar116._12_4_ = (int)auVar397._12_4_;
                  auVar397 = vpslld_avx(auVar116,0x17);
                  auVar397 = vpaddd_avx(auVar397,auVar231);
                  auVar350 = vfmadd213ps_fma(auVar397,auVar401,auVar231);
                  auVar397 = vrcpps_avx(auVar350);
                  auVar231 = vfmsub213ps_fma(auVar350,auVar397,auVar231);
                  auVar114 = vfnmadd132ps_fma(auVar231,auVar397,auVar397);
                  break;
                case 5:
                  auVar422._8_4_ = 0x42b0c0a5;
                  auVar422._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar422._12_4_ = 0x42b0c0a5;
                  auVar397 = vminps_avx(auVar422,auVar114);
                  auVar441._8_4_ = 0xc2b0c0a5;
                  auVar441._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar441._12_4_ = 0xc2b0c0a5;
                  auVar128 = vmaxps_avx(auVar397,auVar441);
                  auVar448._8_4_ = 0x3fb8aa3b;
                  auVar448._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar448._12_4_ = 0x3fb8aa3b;
                  auVar397 = vfmadd213ps_fma(auVar448,auVar128,auVar326);
                  auVar462._0_4_ = (int)auVar397._0_4_;
                  auVar462._4_4_ = (int)auVar397._4_4_;
                  auVar462._8_4_ = (int)auVar397._8_4_;
                  auVar462._12_4_ = (int)auVar397._12_4_;
                  auVar350 = vcvtdq2ps_avx(auVar462);
                  auVar397 = vcmpps_avx(auVar397,auVar350,1);
                  auVar397 = vandps_avx(auVar397,auVar231);
                  auVar397 = vsubps_avx(auVar350,auVar397);
                  auVar423._8_4_ = 0x3f318000;
                  auVar423._0_8_ = 0x3f3180003f318000;
                  auVar423._12_4_ = 0x3f318000;
                  auVar350 = vfmsub231ps_fma(auVar128,auVar397,auVar423);
                  auVar442._8_4_ = 0xb95e8083;
                  auVar442._0_8_ = 0xb95e8083b95e8083;
                  auVar442._12_4_ = 0xb95e8083;
                  auVar128 = vfnmsub231ps_fma(auVar350,auVar397,auVar442);
                  auVar463._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                  auVar463._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                  auVar463._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                  auVar463._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                  auVar342._8_4_ = 0x39506967;
                  auVar342._0_8_ = 0x3950696739506967;
                  auVar342._12_4_ = 0x39506967;
                  auVar350 = vfmadd213ps_fma(auVar342,auVar128,auVar454);
                  auVar232._8_4_ = 0x3c088908;
                  auVar232._0_8_ = 0x3c0889083c088908;
                  auVar232._12_4_ = 0x3c088908;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar232);
                  auVar337._8_4_ = 0x3d2aa9c1;
                  auVar337._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar337._12_4_ = 0x3d2aa9c1;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar337);
                  auVar233._8_4_ = 0x3e2aaaaa;
                  auVar233._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar233._12_4_ = 0x3e2aaaaa;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar233);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar326);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar463,auVar128);
                  auVar157._0_4_ = auVar350._0_4_ + fVar70;
                  auVar157._4_4_ = auVar350._4_4_ + fVar69;
                  auVar157._8_4_ = auVar350._8_4_ + fVar486;
                  auVar157._12_4_ = auVar350._12_4_ + fVar229;
                  auVar349._0_4_ = (int)auVar397._0_4_;
                  auVar349._4_4_ = (int)auVar397._4_4_;
                  auVar349._8_4_ = (int)auVar397._8_4_;
                  auVar349._12_4_ = (int)auVar397._12_4_;
                  auVar397 = vpslld_avx(auVar349,0x17);
                  auVar397 = vpaddd_avx(auVar397,auVar231);
                  auVar71 = vfmadd213ps_fma(auVar397,auVar157,auVar231);
                  auVar158._8_4_ = 0x800000;
                  auVar158._0_8_ = 0x80000000800000;
                  auVar158._12_4_ = 0x800000;
                  auVar397 = vmaxps_avx(auVar71,auVar158);
                  auVar350 = vpsrld_avx(auVar397,0x17);
                  auVar267._8_4_ = 0xffffff82;
                  auVar267._0_8_ = 0xffffff82ffffff82;
                  auVar267._12_4_ = 0xffffff82;
                  auVar350 = vpaddd_avx(auVar350,auVar267);
                  auVar268._8_4_ = 0x807fffff;
                  auVar268._0_8_ = 0x807fffff807fffff;
                  auVar268._12_4_ = 0x807fffff;
                  auVar397 = vandps_avx(auVar397,auVar268);
                  auVar419 = vorps_avx(auVar397,auVar326);
                  auVar128 = vcvtdq2ps_avx(auVar350);
                  auVar269._8_4_ = 0x3f3504f3;
                  auVar269._0_8_ = 0x3f3504f33f3504f3;
                  auVar269._12_4_ = 0x3f3504f3;
                  auVar350 = vcmpps_avx(auVar419,auVar269,1);
                  auVar397 = vandps_avx(auVar350,auVar419);
                  auVar159._0_4_ = auVar397._0_4_ + auVar419._0_4_ + -1.0;
                  auVar159._4_4_ = auVar397._4_4_ + auVar419._4_4_ + -1.0;
                  auVar159._8_4_ = auVar397._8_4_ + auVar419._8_4_ + -1.0;
                  auVar159._12_4_ = auVar397._12_4_ + auVar419._12_4_ + -1.0;
                  auVar397 = vandps_avx(auVar350,auVar231);
                  auVar350 = vsubps_avx(auVar128,auVar397);
                  auVar390._0_4_ = auVar159._0_4_ * auVar159._0_4_;
                  auVar390._4_4_ = auVar159._4_4_ * auVar159._4_4_;
                  auVar390._8_4_ = auVar159._8_4_ * auVar159._8_4_;
                  auVar390._12_4_ = auVar159._12_4_ * auVar159._12_4_;
                  auVar399._8_4_ = 0x3d9021bb;
                  auVar399._0_8_ = 0x3d9021bb3d9021bb;
                  auVar399._12_4_ = 0x3d9021bb;
                  auVar270._8_4_ = 0xbdebd1b8;
                  auVar270._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar270._12_4_ = 0xbdebd1b8;
                  auVar397 = vfmadd213ps_fma(auVar399,auVar159,auVar270);
                  auVar271._8_4_ = 0x3def251a;
                  auVar271._0_8_ = 0x3def251a3def251a;
                  auVar271._12_4_ = 0x3def251a;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar159,auVar271);
                  auVar272._8_4_ = 0xbdfe5d4f;
                  auVar272._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar272._12_4_ = 0xbdfe5d4f;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar159,auVar272);
                  auVar273._8_4_ = 0x3e11e9bf;
                  auVar273._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar273._12_4_ = 0x3e11e9bf;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar159,auVar273);
                  auVar274._8_4_ = 0xbe2aae50;
                  auVar274._0_8_ = 0xbe2aae50be2aae50;
                  auVar274._12_4_ = 0xbe2aae50;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar159,auVar274);
                  auVar275._8_4_ = 0x3e4cceac;
                  auVar275._0_8_ = 0x3e4cceac3e4cceac;
                  auVar275._12_4_ = 0x3e4cceac;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar159,auVar275);
                  auVar276._8_4_ = 0xbe7ffffc;
                  auVar276._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar276._12_4_ = 0xbe7ffffc;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar159,auVar276);
                  auVar277._8_4_ = 0x3eaaaaaa;
                  auVar277._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar277._12_4_ = 0x3eaaaaaa;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar159,auVar277);
                  auVar278._0_4_ = auVar397._0_4_ * auVar390._0_4_ * auVar159._0_4_;
                  auVar278._4_4_ = auVar397._4_4_ * auVar390._4_4_ * auVar159._4_4_;
                  auVar278._8_4_ = auVar397._8_4_ * auVar390._8_4_ * auVar159._8_4_;
                  auVar278._12_4_ = auVar397._12_4_ * auVar390._12_4_ * auVar159._12_4_;
                  auVar397 = vfmadd231ps_fma(auVar278,auVar350,auVar442);
                  auVar128 = vfmsub231ps_fma(auVar397,auVar326,auVar390);
                  auVar397 = vcmpps_avx(auVar71,_DAT_00515040,2);
                  auVar128 = vsubps_avx(auVar128,auVar159);
                  auVar350 = vfnmadd231ps_fma(auVar128,auVar423,auVar350);
                  auVar160._0_4_ = auVar350._0_4_ + auVar350._0_4_;
                  auVar160._4_4_ = auVar350._4_4_ + auVar350._4_4_;
                  auVar160._8_4_ = auVar350._8_4_ + auVar350._8_4_;
                  auVar160._12_4_ = auVar350._12_4_ + auVar350._12_4_;
                  auVar279._8_4_ = 0x7fffffff;
                  auVar279._0_8_ = 0x7fffffff7fffffff;
                  auVar279._12_4_ = 0x7fffffff;
                  auVar397 = vblendvps_avx(auVar160,auVar279,auVar397);
                  auVar280._8_4_ = 0x42b0c0a5;
                  auVar280._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar280._12_4_ = 0x42b0c0a5;
                  auVar397 = vminps_avx(auVar397,auVar280);
                  auVar281._8_4_ = 0xc2b0c0a5;
                  auVar281._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar281._12_4_ = 0xc2b0c0a5;
                  auVar128 = vmaxps_avx(auVar397,auVar281);
                  auVar397 = vfmadd213ps_fma(auVar448,auVar128,auVar326);
                  auVar351._0_4_ = (int)auVar397._0_4_;
                  auVar351._4_4_ = (int)auVar397._4_4_;
                  auVar351._8_4_ = (int)auVar397._8_4_;
                  auVar351._12_4_ = (int)auVar397._12_4_;
                  auVar350 = vcvtdq2ps_avx(auVar351);
                  auVar397 = vcmpps_avx(auVar397,auVar350,1);
                  auVar397 = vandps_avx(auVar397,auVar231);
                  auVar397 = vsubps_avx(auVar350,auVar397);
                  auVar350 = vfmsub231ps_fma(auVar128,auVar397,auVar423);
                  auVar128 = vfnmsub231ps_fma(auVar350,auVar397,auVar442);
                  auVar352._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                  auVar352._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                  auVar352._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                  auVar352._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                  auVar350 = vfmadd213ps_fma(auVar342,auVar128,auVar454);
                  auVar343._8_4_ = 0x3c088908;
                  auVar343._0_8_ = 0x3c0889083c088908;
                  auVar343._12_4_ = 0x3c088908;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar343);
                  auVar388 = ZEXT864(0);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar337);
                  auVar341 = ZEXT1664(auVar231);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar233);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar326);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar352,auVar128);
                  auVar161._0_4_ = auVar350._0_4_ + fVar70;
                  auVar161._4_4_ = auVar350._4_4_ + fVar69;
                  auVar161._8_4_ = auVar350._8_4_ + fVar486;
                  auVar161._12_4_ = auVar350._12_4_ + fVar229;
                  auVar282._0_4_ = (int)auVar397._0_4_;
                  auVar282._4_4_ = (int)auVar397._4_4_;
                  auVar282._8_4_ = (int)auVar397._8_4_;
                  auVar282._12_4_ = (int)auVar397._12_4_;
                  auVar397 = vpslld_avx(auVar282,0x17);
                  auVar397 = vpaddd_avx(auVar397,auVar231);
                  auVar397 = vfmadd213ps_fma(auVar397,auVar161,auVar231);
                  auVar231 = vrcpps_avx(auVar397);
                  auVar353._0_4_ = auVar231._0_4_ + auVar231._0_4_;
                  auVar353._4_4_ = auVar231._4_4_ + auVar231._4_4_;
                  auVar353._8_4_ = auVar231._8_4_ + auVar231._8_4_;
                  auVar353._12_4_ = auVar231._12_4_ + auVar231._12_4_;
                  auVar74._8_4_ = 0x40000000;
                  auVar74._0_8_ = 0x4000000040000000;
                  auVar74._12_4_ = 0x40000000;
                  auVar397 = vfmsub213ps_fma(auVar397,auVar353,auVar74);
                  auVar231 = vfnmadd213ps_fma(auVar397,auVar231,auVar353);
                  auVar114 = vfmsub231ps_fma(auVar114,auVar114,auVar231);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar167._4_4_ = uVar1;
                  auVar167._0_4_ = uVar1;
                  auVar167._8_4_ = uVar1;
                  auVar167._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar283._4_4_ = uVar1;
                  auVar283._0_4_ = uVar1;
                  auVar283._8_4_ = uVar1;
                  auVar283._12_4_ = uVar1;
                  auVar350 = vfmadd231ps_fma(auVar283,auVar114,auVar167);
                  auVar397 = vmaxps_avx(auVar350,auVar397);
                  auVar231 = vminps_avx(auVar397,auVar231);
                  auVar114._0_4_ = auVar231._0_4_ * auVar114._0_4_;
                  auVar114._4_4_ = auVar231._4_4_ * fVar155;
                  auVar114._8_4_ = auVar231._8_4_ * fVar230;
                  auVar114._12_4_ = auVar231._12_4_ * fVar24;
                }
                *(undefined1 (*) [16])ppp_Var54 = auVar114;
                ppp_Var54 = ppp_Var54 + 2;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_a8.w);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar8 == 1) && (local_134 == 8)) {
      if ((long)local_a8.c < 1) goto LAB_002a59b2;
      p_Var48 = pp_Var58[-3];
      iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar56 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_198 = 0;
      auVar388 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar340._8_4_ = 0x3f000000;
      auVar340._0_8_ = 0x3f0000003f000000;
      auVar340._12_4_ = 0x3f000000;
      auVar340._16_4_ = 0x3f000000;
      auVar340._20_4_ = 0x3f000000;
      auVar340._24_4_ = 0x3f000000;
      auVar340._28_4_ = 0x3f000000;
      auVar396 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar341 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar153 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_a8.h) {
          iVar52 = bottom_blob->w;
          iVar65 = bottom_blob->h;
          ppp_Var54 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar14 = bottom_blob->c;
          iVar49 = 0;
          do {
            if (0 < local_a8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar50) * iVar63;
              do {
                if (lVar59 == 0) {
                  auVar459 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar459 = ZEXT3264(*(undefined1 (*) [32])(lVar59 + local_198 * 0x20));
                }
                if (0 < (int)uVar14) {
                  pvVar68 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar56) {
                      uVar57 = 0;
                      uVar55 = 0;
                      do {
                        iVar40 = (((int)uVar55 - uVar56) + 1) * iVar9 + iVar49;
                        if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar10, iVar40 % iVar10 == 0)) &&
                            (iVar41 < iVar65)) && (0 < (int)uVar50)) {
                          uVar61 = (ulong)uVar50;
                          uVar66 = uVar57;
                          iVar40 = iVar64;
                          do {
                            if (((-1 < iVar40) && (iVar42 = iVar40 / iVar67, iVar40 % iVar67 == 0))
                               && (iVar42 < iVar52)) {
                              uVar1 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar42 * 4 +
                                       (long)iVar41 * (long)bottom_blob->w * bottom_blob->elemsize +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar53);
                              auVar219._4_4_ = uVar1;
                              auVar219._0_4_ = uVar1;
                              auVar219._8_4_ = uVar1;
                              auVar219._12_4_ = uVar1;
                              auVar219._16_4_ = uVar1;
                              auVar219._20_4_ = uVar1;
                              auVar219._24_4_ = uVar1;
                              auVar219._28_4_ = uVar1;
                              auVar231 = vfmadd231ps_fma(auVar459._0_32_,auVar219,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar68 + (uVar66 & 0xffffffff) * 4
                                                          ));
                              auVar459 = ZEXT1664(auVar231);
                            }
                            uVar66 = uVar66 + 8;
                            iVar40 = iVar40 + iVar63;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar55 = uVar55 + 1;
                        uVar57 = uVar57 + (ulong)uVar50 * 8;
                      } while (uVar55 != uVar56);
                    }
                    pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar50 * uVar56 * 8) * 4);
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar14);
                }
                auVar148 = auVar459._0_32_;
                auVar456 = auVar341._0_32_;
                auVar138 = auVar153._0_32_;
                auVar142 = auVar388._0_32_;
                auVar144 = auVar396._0_32_;
                fVar70 = auVar341._0_4_;
                fVar69 = auVar341._4_4_;
                fVar486 = auVar341._8_4_;
                fVar229 = auVar341._12_4_;
                fVar230 = auVar341._16_4_;
                fVar24 = auVar341._20_4_;
                fVar155 = auVar341._24_4_;
                fVar25 = auVar341._28_4_;
                auVar154._28_36_ = auVar459._28_36_;
                switch(uVar13) {
                case 1:
                  auVar148 = vmaxps_avx(auVar148,_DAT_0051a220);
                  break;
                case 2:
                  auVar456 = vmaxps_avx(auVar148,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar148 = vminps_avx(auVar148,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar152._4_4_ = uVar1;
                  auVar152._0_4_ = uVar1;
                  auVar152._8_4_ = uVar1;
                  auVar152._12_4_ = uVar1;
                  auVar152._16_4_ = uVar1;
                  auVar152._20_4_ = uVar1;
                  auVar152._24_4_ = uVar1;
                  auVar152._28_4_ = uVar1;
                  auVar231 = vfmadd213ps_fma(auVar152,auVar148,auVar456);
                  auVar148 = ZEXT1632(auVar231);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar226._4_4_ = uVar1;
                  auVar226._0_4_ = uVar1;
                  auVar226._8_4_ = uVar1;
                  auVar226._12_4_ = uVar1;
                  auVar226._16_4_ = uVar1;
                  auVar226._20_4_ = uVar1;
                  auVar226._24_4_ = uVar1;
                  auVar226._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar484._4_4_ = uVar1;
                  auVar484._0_4_ = uVar1;
                  auVar484._8_4_ = uVar1;
                  auVar484._12_4_ = uVar1;
                  auVar484._16_4_ = uVar1;
                  auVar484._20_4_ = uVar1;
                  auVar484._24_4_ = uVar1;
                  auVar484._28_4_ = uVar1;
                  auVar148 = vmaxps_avx(auVar148,auVar226);
                  auVar148 = vminps_avx(auVar484,auVar148);
                  break;
                case 4:
                  auVar149._0_8_ = auVar459._0_8_ ^ 0x8000000080000000;
                  auVar149._8_4_ = -auVar459._8_4_;
                  auVar149._12_4_ = -auVar459._12_4_;
                  auVar149._16_4_ = -auVar459._16_4_;
                  auVar149._20_4_ = -auVar459._20_4_;
                  auVar149._24_4_ = -auVar459._24_4_;
                  auVar149._28_4_ = auVar459._28_4_ ^ 0x80000000;
                  auVar109._8_4_ = 0x42b0c0a5;
                  auVar109._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar109._12_4_ = 0x42b0c0a5;
                  auVar109._16_4_ = 0x42b0c0a5;
                  auVar109._20_4_ = 0x42b0c0a5;
                  auVar109._24_4_ = 0x42b0c0a5;
                  auVar109._28_4_ = 0x42b0c0a5;
                  auVar148 = vminps_avx(auVar149,auVar109);
                  auVar142 = vmaxps_avx(auVar142,auVar148);
                  auVar231 = vfmadd213ps_fma(auVar144,auVar142,auVar340);
                  auVar144 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar231),auVar144,1);
                  auVar148 = vandps_avx(auVar148,auVar456);
                  auVar148 = vsubps_avx(auVar144,auVar148);
                  auVar110._8_4_ = 0x3f318000;
                  auVar110._0_8_ = 0x3f3180003f318000;
                  auVar110._12_4_ = 0x3f318000;
                  auVar110._16_4_ = 0x3f318000;
                  auVar110._20_4_ = 0x3f318000;
                  auVar110._24_4_ = 0x3f318000;
                  auVar110._28_4_ = 0x3f318000;
                  auVar231 = vfmsub231ps_fma(auVar142,auVar148,auVar110);
                  auVar261._8_4_ = 0x395e8083;
                  auVar261._0_8_ = 0x395e8083395e8083;
                  auVar261._12_4_ = 0x395e8083;
                  auVar261._16_4_ = 0x395e8083;
                  auVar261._20_4_ = 0x395e8083;
                  auVar261._24_4_ = 0x395e8083;
                  auVar261._28_4_ = 0x395e8083;
                  auVar397 = vfmsub231ps_fma(ZEXT1632(auVar231),auVar148,auVar261);
                  auVar142 = ZEXT1632(auVar397);
                  auVar37._28_4_ = auVar144._28_4_;
                  auVar37._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar111._8_4_ = 0x3ab743ce;
                  auVar111._0_8_ = 0x3ab743ce3ab743ce;
                  auVar111._12_4_ = 0x3ab743ce;
                  auVar111._16_4_ = 0x3ab743ce;
                  auVar111._20_4_ = 0x3ab743ce;
                  auVar111._24_4_ = 0x3ab743ce;
                  auVar111._28_4_ = 0x3ab743ce;
                  auVar231 = vfmadd213ps_fma(auVar138,auVar142,auVar111);
                  auVar262._8_4_ = 0x3c088908;
                  auVar262._0_8_ = 0x3c0889083c088908;
                  auVar262._12_4_ = 0x3c088908;
                  auVar262._16_4_ = 0x3c088908;
                  auVar262._20_4_ = 0x3c088908;
                  auVar262._24_4_ = 0x3c088908;
                  auVar262._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar262);
                  auVar263._8_4_ = 0x3d2aa9c1;
                  auVar263._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar263._12_4_ = 0x3d2aa9c1;
                  auVar263._16_4_ = 0x3d2aa9c1;
                  auVar263._20_4_ = 0x3d2aa9c1;
                  auVar263._24_4_ = 0x3d2aa9c1;
                  auVar263._28_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar263);
                  auVar264._8_4_ = 0x3e2aaaaa;
                  auVar264._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar264._12_4_ = 0x3e2aaaaa;
                  auVar264._16_4_ = 0x3e2aaaaa;
                  auVar264._20_4_ = 0x3e2aaaaa;
                  auVar264._24_4_ = 0x3e2aaaaa;
                  auVar264._28_4_ = 0x3e2aaaaa;
                  auVar142 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar264);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar340);
                  auVar350 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar37,auVar142);
                  auVar118._0_4_ = (int)auVar148._0_4_;
                  auVar118._4_4_ = (int)auVar148._4_4_;
                  auVar118._8_4_ = (int)auVar148._8_4_;
                  auVar118._12_4_ = (int)auVar148._12_4_;
                  auVar150._16_4_ = (int)auVar148._16_4_;
                  auVar150._0_16_ = auVar118;
                  auVar150._20_4_ = (int)auVar148._20_4_;
                  auVar150._24_4_ = (int)auVar148._24_4_;
                  auVar150._28_4_ = (int)auVar148._28_4_;
                  auVar397 = vpslld_avx(auVar118,0x17);
                  auVar231 = vpslld_avx(auVar150._16_16_,0x17);
                  auVar235._8_4_ = 0x3f800000;
                  auVar235._0_8_ = 0x3f8000003f800000;
                  auVar235._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar231,auVar235);
                  auVar397 = vpaddd_avx(auVar397,auVar235);
                  auVar151._16_16_ = auVar231;
                  auVar151._0_16_ = auVar397;
                  auVar227._0_4_ = auVar350._0_4_ + fVar70;
                  auVar227._4_4_ = auVar350._4_4_ + fVar69;
                  auVar227._8_4_ = auVar350._8_4_ + fVar486;
                  auVar227._12_4_ = auVar350._12_4_ + fVar229;
                  auVar227._16_4_ = fVar230 + 0.0;
                  auVar227._20_4_ = fVar24 + 0.0;
                  auVar227._24_4_ = fVar155 + 0.0;
                  auVar227._28_4_ = fVar25 + 0.0;
                  auVar231 = vfmadd213ps_fma(auVar151,auVar227,auVar456);
                  auVar148 = vrcpps_avx(ZEXT1632(auVar231));
                  auVar231 = vfmsub213ps_fma(ZEXT1632(auVar231),auVar148,auVar456);
                  auVar231 = vfnmadd132ps_fma(ZEXT1632(auVar231),auVar148,auVar148);
                  auVar148 = ZEXT1632(auVar231);
                  break;
                case 5:
                  auVar438._8_4_ = 0x42b0c0a5;
                  auVar438._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar438._12_4_ = 0x42b0c0a5;
                  auVar438._16_4_ = 0x42b0c0a5;
                  auVar438._20_4_ = 0x42b0c0a5;
                  auVar438._24_4_ = 0x42b0c0a5;
                  auVar438._28_4_ = 0x42b0c0a5;
                  auVar148 = vminps_avx(auVar438,auVar148);
                  auVar220 = vmaxps_avx(auVar142,auVar148);
                  auVar231 = vfmadd213ps_fma(auVar144,auVar220,auVar340);
                  auVar209 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar231),auVar209,1);
                  auVar148 = vandps_avx(auVar148,auVar456);
                  auVar148 = vsubps_avx(auVar209,auVar148);
                  auVar346._8_4_ = 0x3f318000;
                  auVar346._0_8_ = 0x3f3180003f318000;
                  auVar346._12_4_ = 0x3f318000;
                  auVar346._16_4_ = 0x3f318000;
                  auVar346._20_4_ = 0x3f318000;
                  auVar346._24_4_ = 0x3f318000;
                  auVar346._28_4_ = 0x3f318000;
                  auVar231 = vfmsub231ps_fma(auVar220,auVar148,auVar346);
                  auVar101._8_4_ = 0xb95e8083;
                  auVar101._0_8_ = 0xb95e8083b95e8083;
                  auVar101._12_4_ = 0xb95e8083;
                  auVar101._16_4_ = 0xb95e8083;
                  auVar101._20_4_ = 0xb95e8083;
                  auVar101._24_4_ = 0xb95e8083;
                  auVar101._28_4_ = 0xb95e8083;
                  auVar397 = vfnmsub231ps_fma(ZEXT1632(auVar231),auVar148,auVar101);
                  auVar220 = ZEXT1632(auVar397);
                  auVar34._28_4_ = auVar209._28_4_;
                  auVar34._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar458._8_4_ = 0x3ab743ce;
                  auVar458._0_8_ = 0x3ab743ce3ab743ce;
                  auVar458._12_4_ = 0x3ab743ce;
                  auVar458._16_4_ = 0x3ab743ce;
                  auVar458._20_4_ = 0x3ab743ce;
                  auVar458._24_4_ = 0x3ab743ce;
                  auVar458._28_4_ = 0x3ab743ce;
                  auVar231 = vfmadd213ps_fma(auVar138,auVar220,auVar458);
                  auVar378._8_4_ = 0x3c088908;
                  auVar378._0_8_ = 0x3c0889083c088908;
                  auVar378._12_4_ = 0x3c088908;
                  auVar378._16_4_ = 0x3c088908;
                  auVar378._20_4_ = 0x3c088908;
                  auVar378._24_4_ = 0x3c088908;
                  auVar378._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar220,auVar378);
                  auVar325._8_4_ = 0x3d2aa9c1;
                  auVar325._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar325._12_4_ = 0x3d2aa9c1;
                  auVar325._16_4_ = 0x3d2aa9c1;
                  auVar325._20_4_ = 0x3d2aa9c1;
                  auVar325._24_4_ = 0x3d2aa9c1;
                  auVar325._28_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar220,auVar325);
                  auVar102._8_4_ = 0x3e2aaaaa;
                  auVar102._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar102._12_4_ = 0x3e2aaaaa;
                  auVar102._16_4_ = 0x3e2aaaaa;
                  auVar102._20_4_ = 0x3e2aaaaa;
                  auVar102._24_4_ = 0x3e2aaaaa;
                  auVar102._28_4_ = 0x3e2aaaaa;
                  auVar220 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar220,auVar102);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar220,auVar340);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar34,auVar220);
                  auVar221._0_4_ = auVar231._0_4_ + fVar70;
                  auVar221._4_4_ = auVar231._4_4_ + fVar69;
                  auVar221._8_4_ = auVar231._8_4_ + fVar486;
                  auVar221._12_4_ = auVar231._12_4_ + fVar229;
                  auVar221._16_4_ = fVar230 + 0.0;
                  auVar221._20_4_ = fVar24 + 0.0;
                  auVar221._24_4_ = fVar155 + 0.0;
                  auVar221._28_4_ = fVar25 + 0.0;
                  auVar234._0_4_ = (int)auVar148._0_4_;
                  auVar234._4_4_ = (int)auVar148._4_4_;
                  auVar234._8_4_ = (int)auVar148._8_4_;
                  auVar234._12_4_ = (int)auVar148._12_4_;
                  auVar257._16_4_ = (int)auVar148._16_4_;
                  auVar257._0_16_ = auVar234;
                  auVar257._20_4_ = (int)auVar148._20_4_;
                  auVar257._24_4_ = (int)auVar148._24_4_;
                  auVar257._28_4_ = (int)auVar148._28_4_;
                  auVar397 = vpslld_avx(auVar234,0x17);
                  auVar231 = vpslld_avx(auVar257._16_16_,0x17);
                  auVar356._8_4_ = 0x3f800000;
                  auVar356._0_8_ = 0x3f8000003f800000;
                  auVar356._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar356,auVar231);
                  auVar397 = vpaddd_avx(auVar397,auVar356);
                  auVar482._16_16_ = auVar231;
                  auVar482._0_16_ = auVar397;
                  auVar350 = vfmadd213ps_fma(auVar482,auVar221,auVar456);
                  auVar103._8_4_ = 0x800000;
                  auVar103._0_8_ = 0x80000000800000;
                  auVar103._12_4_ = 0x800000;
                  auVar103._16_4_ = 0x800000;
                  auVar103._20_4_ = 0x800000;
                  auVar103._24_4_ = 0x800000;
                  auVar103._28_4_ = 0x800000;
                  auVar148 = vmaxps_avx(ZEXT1632(auVar350),auVar103);
                  auVar397 = vpsrld_avx(auVar148._0_16_,0x17);
                  auVar231 = vpsrld_avx(auVar148._16_16_,0x17);
                  auVar104._8_4_ = 0x807fffff;
                  auVar104._0_8_ = 0x807fffff807fffff;
                  auVar104._12_4_ = 0x807fffff;
                  auVar104._16_4_ = 0x807fffff;
                  auVar104._20_4_ = 0x807fffff;
                  auVar104._24_4_ = 0x807fffff;
                  auVar104._28_4_ = 0x807fffff;
                  auVar148 = vandps_avx(auVar148,auVar104);
                  auVar209 = vorps_avx(auVar148,auVar340);
                  auVar105._8_4_ = 0x3f3504f3;
                  auVar105._0_8_ = 0x3f3504f33f3504f3;
                  auVar105._12_4_ = 0x3f3504f3;
                  auVar105._16_4_ = 0x3f3504f3;
                  auVar105._20_4_ = 0x3f3504f3;
                  auVar105._24_4_ = 0x3f3504f3;
                  auVar105._28_4_ = 0x3f3504f3;
                  auVar220 = vcmpps_avx(auVar105,auVar209,2);
                  auVar148 = vandnps_avx(auVar220,auVar209);
                  auVar222._0_4_ = auVar148._0_4_ + auVar209._0_4_ + -1.0;
                  auVar222._4_4_ = auVar148._4_4_ + auVar209._4_4_ + -1.0;
                  auVar222._8_4_ = auVar148._8_4_ + auVar209._8_4_ + -1.0;
                  auVar222._12_4_ = auVar148._12_4_ + auVar209._12_4_ + -1.0;
                  auVar222._16_4_ = auVar148._16_4_ + auVar209._16_4_ + -1.0;
                  auVar222._20_4_ = auVar148._20_4_ + auVar209._20_4_ + -1.0;
                  auVar222._24_4_ = auVar148._24_4_ + auVar209._24_4_ + -1.0;
                  auVar222._28_4_ = auVar148._28_4_ + auVar209._28_4_ + -1.0;
                  auVar231 = vpsubd_avx(auVar231,auVar220._16_16_);
                  auVar424._8_4_ = 0xffffff81;
                  auVar424._0_8_ = 0xffffff81ffffff81;
                  auVar424._12_4_ = 0xffffff81;
                  auVar231 = vpaddd_avx(auVar231,auVar424);
                  auVar397 = vpsubd_avx(auVar397,auVar220._0_16_);
                  auVar397 = vpaddd_avx(auVar424,auVar397);
                  auVar258._16_16_ = auVar231;
                  auVar258._0_16_ = auVar397;
                  auVar35._4_4_ = auVar222._4_4_ * auVar222._4_4_;
                  auVar35._0_4_ = auVar222._0_4_ * auVar222._0_4_;
                  auVar35._8_4_ = auVar222._8_4_ * auVar222._8_4_;
                  auVar35._12_4_ = auVar222._12_4_ * auVar222._12_4_;
                  auVar35._16_4_ = auVar222._16_4_ * auVar222._16_4_;
                  auVar35._20_4_ = auVar222._20_4_ * auVar222._20_4_;
                  auVar35._24_4_ = auVar222._24_4_ * auVar222._24_4_;
                  auVar35._28_4_ = auVar220._28_4_;
                  auVar417._8_4_ = 0x3d9021bb;
                  auVar417._0_8_ = 0x3d9021bb3d9021bb;
                  auVar417._12_4_ = 0x3d9021bb;
                  auVar417._16_4_ = 0x3d9021bb;
                  auVar417._20_4_ = 0x3d9021bb;
                  auVar417._24_4_ = 0x3d9021bb;
                  auVar417._28_4_ = 0x3d9021bb;
                  auVar379._8_4_ = 0xbdebd1b8;
                  auVar379._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar379._12_4_ = 0xbdebd1b8;
                  auVar379._16_4_ = 0xbdebd1b8;
                  auVar379._20_4_ = 0xbdebd1b8;
                  auVar379._24_4_ = 0xbdebd1b8;
                  auVar379._28_4_ = 0xbdebd1b8;
                  auVar231 = vfmadd213ps_fma(auVar417,auVar222,auVar379);
                  auVar380._8_4_ = 0x3def251a;
                  auVar380._0_8_ = 0x3def251a3def251a;
                  auVar380._12_4_ = 0x3def251a;
                  auVar380._16_4_ = 0x3def251a;
                  auVar380._20_4_ = 0x3def251a;
                  auVar380._24_4_ = 0x3def251a;
                  auVar380._28_4_ = 0x3def251a;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar222,auVar380);
                  auVar381._8_4_ = 0xbdfe5d4f;
                  auVar381._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar381._12_4_ = 0xbdfe5d4f;
                  auVar381._16_4_ = 0xbdfe5d4f;
                  auVar381._20_4_ = 0xbdfe5d4f;
                  auVar381._24_4_ = 0xbdfe5d4f;
                  auVar381._28_4_ = 0xbdfe5d4f;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar222,auVar381);
                  auVar382._8_4_ = 0x3e11e9bf;
                  auVar382._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar382._12_4_ = 0x3e11e9bf;
                  auVar382._16_4_ = 0x3e11e9bf;
                  auVar382._20_4_ = 0x3e11e9bf;
                  auVar382._24_4_ = 0x3e11e9bf;
                  auVar382._28_4_ = 0x3e11e9bf;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar222,auVar382);
                  auVar383._8_4_ = 0xbe2aae50;
                  auVar383._0_8_ = 0xbe2aae50be2aae50;
                  auVar383._12_4_ = 0xbe2aae50;
                  auVar383._16_4_ = 0xbe2aae50;
                  auVar383._20_4_ = 0xbe2aae50;
                  auVar383._24_4_ = 0xbe2aae50;
                  auVar383._28_4_ = 0xbe2aae50;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar222,auVar383);
                  auVar384._8_4_ = 0x3e4cceac;
                  auVar384._0_8_ = 0x3e4cceac3e4cceac;
                  auVar384._12_4_ = 0x3e4cceac;
                  auVar384._16_4_ = 0x3e4cceac;
                  auVar384._20_4_ = 0x3e4cceac;
                  auVar384._24_4_ = 0x3e4cceac;
                  auVar384._28_4_ = 0x3e4cceac;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar222,auVar384);
                  auVar385._8_4_ = 0xbe7ffffc;
                  auVar385._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar385._12_4_ = 0xbe7ffffc;
                  auVar385._16_4_ = 0xbe7ffffc;
                  auVar385._20_4_ = 0xbe7ffffc;
                  auVar385._24_4_ = 0xbe7ffffc;
                  auVar385._28_4_ = 0xbe7ffffc;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar222,auVar385);
                  auVar386._8_4_ = 0x3eaaaaaa;
                  auVar386._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar386._12_4_ = 0x3eaaaaaa;
                  auVar386._16_4_ = 0x3eaaaaaa;
                  auVar386._20_4_ = 0x3eaaaaaa;
                  auVar386._24_4_ = 0x3eaaaaaa;
                  auVar386._28_4_ = 0x3eaaaaaa;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar222,auVar386);
                  auVar418._0_4_ = auVar222._0_4_ * auVar222._0_4_ * auVar222._0_4_ * auVar231._0_4_
                  ;
                  auVar418._4_4_ = auVar222._4_4_ * auVar222._4_4_ * auVar222._4_4_ * auVar231._4_4_
                  ;
                  auVar418._8_4_ = auVar222._8_4_ * auVar222._8_4_ * auVar222._8_4_ * auVar231._8_4_
                  ;
                  auVar418._12_4_ =
                       auVar222._12_4_ * auVar222._12_4_ * auVar222._12_4_ * auVar231._12_4_;
                  auVar418._16_4_ = auVar222._16_4_ * auVar222._16_4_ * auVar222._16_4_ * 0.0;
                  auVar418._20_4_ = auVar222._20_4_ * auVar222._20_4_ * auVar222._20_4_ * 0.0;
                  auVar418._24_4_ = auVar222._24_4_ * auVar222._24_4_ * auVar222._24_4_ * 0.0;
                  auVar418._28_4_ = 0;
                  auVar220 = vcvtdq2ps_avx(auVar258);
                  auVar439._8_4_ = 0xb95e8083;
                  auVar439._0_8_ = 0xb95e8083b95e8083;
                  auVar439._12_4_ = 0xb95e8083;
                  auVar439._16_4_ = 0xb95e8083;
                  auVar439._20_4_ = 0xb95e8083;
                  auVar439._24_4_ = 0xb95e8083;
                  auVar439._28_4_ = 0xb95e8083;
                  auVar231 = vfmadd231ps_fma(auVar418,auVar220,auVar439);
                  auVar231 = vfmsub231ps_fma(ZEXT1632(auVar231),auVar340,auVar35);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar350),ZEXT832(0) << 0x20,2);
                  auVar209 = vsubps_avx(ZEXT1632(auVar231),auVar222);
                  auVar231 = vfmsub231ps_fma(auVar209,auVar346,auVar220);
                  auVar387._8_4_ = 0xc0000000;
                  auVar387._0_8_ = 0xc0000000c0000000;
                  auVar387._12_4_ = 0xc0000000;
                  auVar387._16_4_ = 0xc0000000;
                  auVar387._20_4_ = 0xc0000000;
                  auVar387._24_4_ = 0xc0000000;
                  auVar387._28_4_ = 0xc0000000;
                  auVar223._0_4_ = auVar231._0_4_ * -2.0;
                  auVar223._4_4_ = auVar231._4_4_ * -2.0;
                  auVar223._8_4_ = auVar231._8_4_ * -2.0;
                  auVar223._12_4_ = auVar231._12_4_ * -2.0;
                  auVar223._16_4_ = 0x80000000;
                  auVar223._20_4_ = 0x80000000;
                  auVar223._24_4_ = 0x80000000;
                  auVar223._28_4_ = 0;
                  auVar259._8_4_ = 0x7fffffff;
                  auVar259._0_8_ = 0x7fffffff7fffffff;
                  auVar259._12_4_ = 0x7fffffff;
                  auVar259._16_4_ = 0x7fffffff;
                  auVar259._20_4_ = 0x7fffffff;
                  auVar259._24_4_ = 0x7fffffff;
                  auVar259._28_4_ = 0x7fffffff;
                  auVar148 = vblendvps_avx(auVar223,auVar259,auVar148);
                  auVar148 = vminps_avx(auVar438,auVar148);
                  auVar388 = ZEXT3264(auVar142);
                  auVar142 = vmaxps_avx(auVar142,auVar148);
                  auVar396 = ZEXT3264(auVar144);
                  auVar231 = vfmadd213ps_fma(auVar144,auVar142,auVar340);
                  auVar144 = vroundps_avx(ZEXT1632(auVar231),1);
                  auVar148 = vcmpps_avx(ZEXT1632(auVar231),auVar144,1);
                  auVar148 = vandps_avx(auVar148,auVar456);
                  auVar148 = vsubps_avx(auVar144,auVar148);
                  auVar231 = vfmsub231ps_fma(auVar142,auVar148,auVar346);
                  auVar397 = vfnmsub231ps_fma(ZEXT1632(auVar231),auVar148,auVar439);
                  auVar142 = ZEXT1632(auVar397);
                  auVar36._28_4_ = auVar144._28_4_;
                  auVar36._0_28_ =
                       ZEXT1628(CONCAT412(auVar397._12_4_ * auVar397._12_4_,
                                          CONCAT48(auVar397._8_4_ * auVar397._8_4_,
                                                   CONCAT44(auVar397._4_4_ * auVar397._4_4_,
                                                            auVar397._0_4_ * auVar397._0_4_))));
                  auVar153 = ZEXT3264(auVar138);
                  auVar231 = vfmadd213ps_fma(auVar138,auVar142,auVar458);
                  auVar483._8_4_ = 0x3c088908;
                  auVar483._0_8_ = 0x3c0889083c088908;
                  auVar483._12_4_ = 0x3c088908;
                  auVar483._16_4_ = 0x3c088908;
                  auVar483._20_4_ = 0x3c088908;
                  auVar483._24_4_ = 0x3c088908;
                  auVar483._28_4_ = 0x3c088908;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar483);
                  auVar106._8_4_ = 0x3d2aa9c1;
                  auVar106._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar106._12_4_ = 0x3d2aa9c1;
                  auVar106._16_4_ = 0x3d2aa9c1;
                  auVar106._20_4_ = 0x3d2aa9c1;
                  auVar106._24_4_ = 0x3d2aa9c1;
                  auVar106._28_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar106);
                  auVar107._8_4_ = 0x3e2aaaaa;
                  auVar107._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar107._12_4_ = 0x3e2aaaaa;
                  auVar107._16_4_ = 0x3e2aaaaa;
                  auVar107._20_4_ = 0x3e2aaaaa;
                  auVar107._24_4_ = 0x3e2aaaaa;
                  auVar107._28_4_ = 0x3e2aaaaa;
                  auVar142 = ZEXT1632(auVar397);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar107);
                  auVar231 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar142,auVar340);
                  auVar350 = vfmadd213ps_fma(ZEXT1632(auVar231),auVar36,auVar142);
                  auVar341 = ZEXT3264(auVar456);
                  auVar168._0_4_ = (int)auVar148._0_4_;
                  auVar168._4_4_ = (int)auVar148._4_4_;
                  auVar168._8_4_ = (int)auVar148._8_4_;
                  auVar168._12_4_ = (int)auVar148._12_4_;
                  auVar224._16_4_ = (int)auVar148._16_4_;
                  auVar224._0_16_ = auVar168;
                  auVar224._20_4_ = (int)auVar148._20_4_;
                  auVar224._24_4_ = (int)auVar148._24_4_;
                  auVar224._28_4_ = (int)auVar148._28_4_;
                  auVar397 = vpslld_avx(auVar168,0x17);
                  auVar231 = vpslld_avx(auVar224._16_16_,0x17);
                  auVar284._8_4_ = 0x3f800000;
                  auVar284._0_8_ = 0x3f8000003f800000;
                  auVar284._12_4_ = 0x3f800000;
                  auVar231 = vpaddd_avx(auVar231,auVar284);
                  auVar397 = vpaddd_avx(auVar397,auVar284);
                  auVar225._16_16_ = auVar231;
                  auVar225._0_16_ = auVar397;
                  auVar260._0_4_ = auVar350._0_4_ + fVar70;
                  auVar260._4_4_ = auVar350._4_4_ + fVar69;
                  auVar260._8_4_ = auVar350._8_4_ + fVar486;
                  auVar260._12_4_ = auVar350._12_4_ + fVar229;
                  auVar260._16_4_ = fVar230 + 0.0;
                  auVar260._20_4_ = fVar24 + 0.0;
                  auVar260._24_4_ = fVar155 + 0.0;
                  auVar260._28_4_ = fVar25 + 0.0;
                  auVar231 = vfmadd213ps_fma(auVar225,auVar260,auVar456);
                  auVar148 = vrcpps_avx(ZEXT1632(auVar231));
                  auVar231 = vfmsub213ps_fma(ZEXT1632(auVar231),auVar148,auVar456);
                  auVar231 = vfnmadd132ps_fma(ZEXT1632(auVar231),auVar148,auVar148);
                  auVar108._8_4_ = 0xbf800000;
                  auVar108._0_8_ = 0xbf800000bf800000;
                  auVar108._12_4_ = 0xbf800000;
                  auVar108._16_4_ = 0xbf800000;
                  auVar108._20_4_ = 0xbf800000;
                  auVar108._24_4_ = 0xbf800000;
                  auVar108._28_4_ = 0xbf800000;
                  auVar231 = vfnmadd213ps_fma(ZEXT1632(auVar231),auVar387,auVar108);
                  auVar195 = ZEXT1628(auVar231);
                  goto LAB_002a5466;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar228._4_4_ = uVar1;
                  auVar228._0_4_ = uVar1;
                  auVar228._8_4_ = uVar1;
                  auVar228._12_4_ = uVar1;
                  auVar228._16_4_ = uVar1;
                  auVar228._20_4_ = uVar1;
                  auVar228._24_4_ = uVar1;
                  auVar228._28_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar265._4_4_ = uVar1;
                  auVar265._0_4_ = uVar1;
                  auVar265._8_4_ = uVar1;
                  auVar265._12_4_ = uVar1;
                  auVar265._16_4_ = uVar1;
                  auVar265._20_4_ = uVar1;
                  auVar265._24_4_ = uVar1;
                  auVar265._28_4_ = uVar1;
                  auVar231 = vfmadd231ps_fma(auVar265,auVar148,auVar228);
                  auVar148 = vmaxps_avx(ZEXT1632(auVar231),_DAT_0051a220);
                  auVar148 = vminps_avx(auVar148,auVar456);
                  auVar195 = auVar148._0_28_;
LAB_002a5466:
                  auVar154._0_4_ = auVar195._0_4_ * auVar459._0_4_;
                  auVar154._4_4_ = auVar195._4_4_ * auVar459._4_4_;
                  auVar154._8_4_ = auVar195._8_4_ * auVar459._8_4_;
                  auVar154._12_4_ = auVar195._12_4_ * auVar459._12_4_;
                  auVar154._16_4_ = auVar195._16_4_ * auVar459._16_4_;
                  auVar154._20_4_ = auVar195._20_4_ * auVar459._20_4_;
                  auVar154._24_4_ = auVar195._24_4_ * auVar459._24_4_;
                  auVar148 = auVar154._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var54 = auVar148;
                ppp_Var54 = ppp_Var54 + 4;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_a8.w);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar8 == 8) && (local_134 == 1)) {
      lVar59 = (long)local_a8.c;
      if (0 < lVar59) {
        p_Var48 = pp_Var58[-3];
        iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
        iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
        iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
        iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
        uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
        lVar47 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
        uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
        uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
        local_60 = local_a8.elemsize * local_a8.cstep;
        local_58 = (Allocator *)local_a8.data;
        iVar52 = bottom_blob->w;
        iVar65 = bottom_blob->h;
        uVar12 = bottom_blob->c;
        local_158 = 0;
        do {
          if (0 < iVar7) {
            sVar17 = (this->weight_data_tm).cstep;
            sVar18 = (this->weight_data_tm).elemsize;
            local_128 = (_func_int ***)((long)&local_58->_vptr_Allocator + local_60 * local_158);
            pvVar68 = (this->weight_data_tm).data;
            iVar49 = 0;
            do {
              if (0 < iVar6) {
                iVar40 = bottom_blob->w;
                pvVar16 = bottom_blob->data;
                sVar19 = bottom_blob->elemsize;
                sVar20 = bottom_blob->cstep;
                pfVar21 = *(float **)(&this->field_0x118 + (long)p_Var48);
                uVar50 = 0;
                iVar64 = (1 - uVar8) * iVar63;
                do {
                  if (lVar47 == 0) {
                    fVar70 = 0.0;
                  }
                  else {
                    fVar70 = *(float *)(lVar47 + local_158 * 4);
                  }
                  if ((int)uVar12 < 1) {
                    auVar148 = SUB6432(ZEXT864(0),0);
                  }
                  else {
                    auVar341 = ZEXT864(0);
                    uVar53 = 0;
                    pvVar60 = (void *)(sVar17 * local_158 * sVar18 + (long)pvVar68);
                    do {
                      if (0 < (int)uVar11) {
                        uVar57 = 0;
                        uVar55 = 0;
                        do {
                          iVar41 = (((int)uVar55 - uVar11) + 1) * iVar9 + iVar49;
                          if ((((-1 < iVar41) && (iVar42 = iVar41 / iVar10, iVar41 % iVar10 == 0))
                              && (0 < (int)uVar8)) && (iVar42 < iVar65)) {
                            uVar61 = (ulong)uVar8;
                            uVar66 = uVar57;
                            iVar41 = iVar64;
                            do {
                              if (((-1 < iVar41) && (iVar43 = iVar41 / iVar67, iVar41 % iVar67 == 0)
                                  ) && (iVar43 < iVar52)) {
                                auVar231 = vfmadd231ps_fma(auVar341._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar16 +
                                                            (long)(iVar43 << 3) * 4 +
                                                            (long)iVar42 * (long)iVar40 * sVar19 +
                                                            sVar20 * sVar19 * uVar53),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar60 +
                                                            (uVar66 & 0xffffffff) * 4));
                                auVar341 = ZEXT1664(auVar231);
                              }
                              uVar66 = uVar66 + 8;
                              iVar41 = iVar41 + iVar63;
                              uVar61 = uVar61 - 1;
                            } while (uVar61 != 0);
                          }
                          uVar55 = uVar55 + 1;
                          uVar57 = uVar57 + (ulong)uVar8 * 8;
                        } while (uVar55 != uVar11);
                      }
                      auVar148 = auVar341._0_32_;
                      pvVar60 = (void *)((long)pvVar60 + (long)(int)(uVar8 * uVar11 * 8) * 4);
                      uVar53 = uVar53 + 1;
                    } while (uVar53 != uVar12);
                  }
                  auVar119._0_4_ = auVar148._16_4_ + auVar148._0_4_;
                  auVar119._4_4_ = auVar148._20_4_ + auVar148._4_4_;
                  auVar119._8_4_ = auVar148._24_4_ + auVar148._8_4_;
                  auVar119._12_4_ = auVar148._28_4_ + auVar148._12_4_;
                  auVar231 = vshufpd_avx(auVar119,auVar119,1);
                  auVar120._0_4_ = auVar231._0_4_ + auVar119._0_4_;
                  auVar120._4_4_ = auVar231._4_4_ + auVar119._4_4_;
                  auVar120._8_4_ = auVar231._8_4_ + auVar119._8_4_;
                  auVar120._12_4_ = auVar231._12_4_ + auVar119._12_4_;
                  auVar231 = vmovshdup_avx(auVar120);
                  fVar70 = auVar231._0_4_ + fVar70 + auVar120._0_4_;
                  auVar231 = ZEXT416((uint)fVar70);
                  fVar69 = fVar70;
                  switch(uVar13) {
                  case 1:
                    auVar231 = vmaxss_avx(auVar231,ZEXT416(0));
                    fVar69 = auVar231._0_4_;
                    break;
                  case 2:
                    auVar78._0_12_ = ZEXT812(0);
                    auVar78._12_4_ = 0;
                    auVar231 = vcmpss_avx(auVar78,auVar231,1);
                    auVar170._8_4_ = 0x3f800000;
                    auVar170._0_8_ = 0x3f8000003f800000;
                    auVar170._12_4_ = 0x3f800000;
                    auVar231 = vblendvps_avx(ZEXT416((uint)*pfVar21),auVar170,auVar231);
                    fVar69 = auVar231._0_4_ * fVar70;
                    break;
                  case 3:
                    auVar231 = vmaxss_avx(auVar231,ZEXT416((uint)*pfVar21));
                    fVar69 = auVar231._0_4_;
                    if (pfVar21[1] < auVar231._0_4_) {
                      fVar69 = pfVar21[1];
                    }
                    break;
                  case 4:
                    auVar231 = vminss_avx(auVar231,ZEXT416(0x42b0c0a5));
                    auVar121._0_8_ = auVar231._0_8_ ^ 0x8000000080000000;
                    auVar121._8_4_ = auVar231._8_4_ ^ 0x80000000;
                    auVar121._12_4_ = auVar231._12_4_ ^ 0x80000000;
                    auVar231 = vcmpss_avx(auVar231,ZEXT416(0xc2b0c0a5),1);
                    auVar169._8_4_ = 0x42b0c0a5;
                    auVar169._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar169._12_4_ = 0x42b0c0a5;
                    auVar231 = vblendvps_avx(auVar121,auVar169,auVar231);
                    fVar70 = expf(auVar231._0_4_);
                    fVar69 = 1.0 / (fVar70 + 1.0);
                    break;
                  case 5:
                    fVar69 = expf(fVar70);
                    fVar69 = logf(fVar69 + 1.0);
                    fVar69 = tanhf(fVar69);
                    fVar69 = fVar69 * fVar70;
                    break;
                  case 6:
                    fVar486 = *pfVar21;
                    fVar229 = -pfVar21[1] / fVar486;
                    fVar69 = 0.0;
                    if ((fVar229 <= fVar70) && (fVar69 = fVar70, fVar70 <= fVar229 + 1.0 / fVar486))
                    {
                      auVar231 = vfmadd213ss_fma(ZEXT416((uint)fVar486),auVar231,
                                                 ZEXT416((uint)pfVar21[1]));
                      fVar69 = auVar231._0_4_ * fVar70;
                    }
                  }
                  *(float *)local_128 = fVar69;
                  local_128 = (_func_int ***)((long)local_128 + 4);
                  uVar50 = uVar50 + 1;
                  iVar64 = iVar64 + 1;
                } while (uVar50 != iVar6);
              }
              iVar49 = iVar49 + 1;
            } while (iVar49 != iVar7);
          }
          local_158 = local_158 + 1;
        } while (local_158 != lVar59);
      }
      goto LAB_002a59b2;
    }
    local_50._0_4_ = local_134 ^ 4;
    if ((uVar8 == 4 && local_134 == 4) && (0 < (long)local_a8.c)) {
      p_Var48 = pp_Var58[-3];
      iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar56 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_198 = 0;
      auVar388 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar338._8_4_ = 0x3f000000;
      auVar338._0_8_ = 0x3f0000003f000000;
      auVar338._12_4_ = 0x3f000000;
      auVar341 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar455._8_4_ = 0x3ab743ce;
      auVar455._0_8_ = 0x3ab743ce3ab743ce;
      auVar455._12_4_ = 0x3ab743ce;
      auVar236._8_4_ = 0x3c088908;
      auVar236._0_8_ = 0x3c0889083c088908;
      auVar236._12_4_ = 0x3c088908;
      do {
        if (0 < local_a8.h) {
          iVar52 = bottom_blob->w;
          iVar65 = bottom_blob->h;
          ppp_Var54 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar14 = bottom_blob->c;
          iVar49 = 0;
          do {
            if (0 < local_a8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar50) * iVar63;
              do {
                if (lVar59 == 0) {
                  auVar122 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar122 = *(undefined1 (*) [16])(lVar59 + local_198 * 0x10);
                }
                auVar396 = ZEXT1664(auVar122);
                if (0 < (int)uVar14) {
                  pvVar68 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar16 = bottom_blob->data;
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar56) {
                      uVar55 = 0;
                      uVar57 = 0;
                      do {
                        iVar40 = (((int)uVar57 - uVar56) + 1) * iVar9 + iVar49;
                        if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar10, iVar40 % iVar10 == 0)) &&
                            (0 < (int)uVar50)) && (iVar41 < iVar65)) {
                          lVar47 = (long)iVar41 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar53;
                          uVar61 = uVar55;
                          uVar66 = (ulong)uVar50;
                          iVar40 = iVar64;
                          do {
                            if (((-1 < iVar40) && (iVar41 = iVar40 / iVar67, iVar40 % iVar67 == 0))
                               && (iVar41 < iVar52)) {
                              lVar45 = (long)(iVar41 << 2);
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47);
                              auVar171._4_4_ = uVar1;
                              auVar171._0_4_ = uVar1;
                              auVar171._8_4_ = uVar1;
                              auVar171._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 4);
                              auVar285._4_4_ = uVar1;
                              auVar285._0_4_ = uVar1;
                              auVar285._8_4_ = uVar1;
                              auVar285._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 8);
                              auVar357._4_4_ = uVar1;
                              auVar357._0_4_ = uVar1;
                              auVar357._8_4_ = uVar1;
                              auVar357._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar16 + lVar45 * 4 + lVar47 + 0xc);
                              auVar391._4_4_ = uVar1;
                              auVar391._0_4_ = uVar1;
                              auVar391._8_4_ = uVar1;
                              auVar391._12_4_ = uVar1;
                              uVar46 = uVar61 & 0xffffffff;
                              auVar231 = vfmadd231ps_fma(auVar396._0_16_,auVar171,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar285,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x10));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar357,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x20));
                              auVar231 = vfmadd231ps_fma(auVar231,auVar391,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + uVar46 * 4 + 0x30));
                              auVar396 = ZEXT1664(auVar231);
                            }
                            uVar61 = uVar61 + 0x10;
                            iVar40 = iVar40 + iVar63;
                            uVar66 = uVar66 - 1;
                          } while (uVar66 != 0);
                        }
                        uVar57 = uVar57 + 1;
                        uVar55 = uVar55 + (ulong)uVar50 * 0x10;
                      } while (uVar57 != uVar56);
                    }
                    auVar122 = auVar396._0_16_;
                    pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar50 * uVar56 * 0x10) * 4);
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar14);
                }
                auVar397 = auVar388._0_16_;
                auVar231 = auVar341._0_16_;
                fVar70 = auVar341._0_4_;
                fVar69 = auVar341._4_4_;
                fVar486 = auVar341._8_4_;
                fVar229 = auVar341._12_4_;
                fVar155 = auVar122._4_4_;
                fVar230 = auVar122._8_4_;
                fVar24 = auVar122._12_4_;
                switch(uVar13) {
                case 1:
                  auVar122 = vmaxps_avx(auVar397,auVar122);
                  break;
                case 2:
                  auVar231 = vmaxps_avx(auVar397,auVar122);
                  auVar397 = vminps_avx(auVar397,auVar122);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar125._4_4_ = uVar1;
                  auVar125._0_4_ = uVar1;
                  auVar125._8_4_ = uVar1;
                  auVar125._12_4_ = uVar1;
                  auVar122 = vfmadd213ps_fma(auVar125,auVar397,auVar231);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar362._4_4_ = uVar1;
                  auVar362._0_4_ = uVar1;
                  auVar362._8_4_ = uVar1;
                  auVar362._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar469._4_4_ = uVar1;
                  auVar469._0_4_ = uVar1;
                  auVar469._8_4_ = uVar1;
                  auVar469._12_4_ = uVar1;
                  auVar231 = vmaxps_avx(auVar362,auVar122);
                  auVar122 = vminps_avx(auVar469,auVar231);
                  break;
                case 4:
                  auVar123._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
                  auVar123._8_4_ = -fVar230;
                  auVar123._12_4_ = -fVar24;
                  auVar177._8_4_ = 0x42b0c0a5;
                  auVar177._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar177._12_4_ = 0x42b0c0a5;
                  auVar397 = vminps_avx(auVar123,auVar177);
                  auVar178._8_4_ = 0xc2b0c0a5;
                  auVar178._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar178._12_4_ = 0xc2b0c0a5;
                  auVar128 = vmaxps_avx(auVar397,auVar178);
                  auVar363._8_4_ = 0x3fb8aa3b;
                  auVar363._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar363._12_4_ = 0x3fb8aa3b;
                  auVar397 = vfmadd213ps_fma(auVar363,auVar128,auVar338);
                  auVar470._0_4_ = (int)auVar397._0_4_;
                  auVar470._4_4_ = (int)auVar397._4_4_;
                  auVar470._8_4_ = (int)auVar397._8_4_;
                  auVar470._12_4_ = (int)auVar397._12_4_;
                  auVar350 = vcvtdq2ps_avx(auVar470);
                  auVar397 = vcmpps_avx(auVar397,auVar350,1);
                  auVar397 = vandps_avx(auVar397,auVar231);
                  auVar397 = vsubps_avx(auVar350,auVar397);
                  auVar81._8_4_ = 0x3f318000;
                  auVar81._0_8_ = 0x3f3180003f318000;
                  auVar81._12_4_ = 0x3f318000;
                  auVar350 = vfmsub231ps_fma(auVar128,auVar397,auVar81);
                  auVar179._8_4_ = 0x395e8083;
                  auVar179._0_8_ = 0x395e8083395e8083;
                  auVar179._12_4_ = 0x395e8083;
                  auVar128 = vfmsub231ps_fma(auVar350,auVar397,auVar179);
                  auVar471._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                  auVar471._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                  auVar471._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                  auVar471._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                  auVar403._8_4_ = 0x39506967;
                  auVar403._0_8_ = 0x3950696739506967;
                  auVar403._12_4_ = 0x39506967;
                  auVar180._8_4_ = 0x3ab743ce;
                  auVar180._0_8_ = 0x3ab743ce3ab743ce;
                  auVar180._12_4_ = 0x3ab743ce;
                  auVar350 = vfmadd213ps_fma(auVar403,auVar128,auVar180);
                  auVar181._8_4_ = 0x3c088908;
                  auVar181._0_8_ = 0x3c0889083c088908;
                  auVar181._12_4_ = 0x3c088908;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar181);
                  auVar82._8_4_ = 0x3d2aa9c1;
                  auVar82._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar82._12_4_ = 0x3d2aa9c1;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar82);
                  auVar83._8_4_ = 0x3e2aaaaa;
                  auVar83._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar83._12_4_ = 0x3e2aaaaa;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar83);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar338);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar471,auVar128);
                  auVar404._0_4_ = auVar350._0_4_ + fVar70;
                  auVar404._4_4_ = auVar350._4_4_ + fVar69;
                  auVar404._8_4_ = auVar350._8_4_ + fVar486;
                  auVar404._12_4_ = auVar350._12_4_ + fVar229;
                  auVar124._0_4_ = (int)auVar397._0_4_;
                  auVar124._4_4_ = (int)auVar397._4_4_;
                  auVar124._8_4_ = (int)auVar397._8_4_;
                  auVar124._12_4_ = (int)auVar397._12_4_;
                  auVar397 = vpslld_avx(auVar124,0x17);
                  auVar397 = vpaddd_avx(auVar397,auVar231);
                  auVar350 = vfmadd213ps_fma(auVar397,auVar404,auVar231);
                  auVar388 = ZEXT464(0) << 0x20;
                  auVar397 = vrcpps_avx(auVar350);
                  auVar231 = vfmsub213ps_fma(auVar350,auVar397,auVar231);
                  auVar122 = vfnmadd132ps_fma(auVar231,auVar397,auVar397);
                  break;
                case 5:
                  auVar425._8_4_ = 0x42b0c0a5;
                  auVar425._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar425._12_4_ = 0x42b0c0a5;
                  auVar397 = vminps_avx(auVar425,auVar122);
                  auVar443._8_4_ = 0xc2b0c0a5;
                  auVar443._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar443._12_4_ = 0xc2b0c0a5;
                  auVar128 = vmaxps_avx(auVar397,auVar443);
                  auVar449._8_4_ = 0x3fb8aa3b;
                  auVar449._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar449._12_4_ = 0x3fb8aa3b;
                  auVar397 = vfmadd213ps_fma(auVar449,auVar128,auVar338);
                  auVar467._0_4_ = (int)auVar397._0_4_;
                  auVar467._4_4_ = (int)auVar397._4_4_;
                  auVar467._8_4_ = (int)auVar397._8_4_;
                  auVar467._12_4_ = (int)auVar397._12_4_;
                  auVar350 = vcvtdq2ps_avx(auVar467);
                  auVar397 = vcmpps_avx(auVar397,auVar350,1);
                  auVar397 = vandps_avx(auVar397,auVar231);
                  auVar397 = vsubps_avx(auVar350,auVar397);
                  auVar426._8_4_ = 0x3f318000;
                  auVar426._0_8_ = 0x3f3180003f318000;
                  auVar426._12_4_ = 0x3f318000;
                  auVar350 = vfmsub231ps_fma(auVar128,auVar397,auVar426);
                  auVar444._8_4_ = 0xb95e8083;
                  auVar444._0_8_ = 0xb95e8083b95e8083;
                  auVar444._12_4_ = 0xb95e8083;
                  auVar128 = vfnmsub231ps_fma(auVar350,auVar397,auVar444);
                  auVar468._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                  auVar468._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                  auVar468._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                  auVar468._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                  auVar344._8_4_ = 0x39506967;
                  auVar344._0_8_ = 0x3950696739506967;
                  auVar344._12_4_ = 0x39506967;
                  auVar350 = vfmadd213ps_fma(auVar344,auVar128,auVar455);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar236);
                  auVar327._8_4_ = 0x3d2aa9c1;
                  auVar327._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar327._12_4_ = 0x3d2aa9c1;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar327);
                  auVar286._8_4_ = 0x3e2aaaaa;
                  auVar286._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar286._12_4_ = 0x3e2aaaaa;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar286);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar338);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar468,auVar128);
                  auVar172._0_4_ = auVar350._0_4_ + fVar70;
                  auVar172._4_4_ = auVar350._4_4_ + fVar69;
                  auVar172._8_4_ = auVar350._8_4_ + fVar486;
                  auVar172._12_4_ = auVar350._12_4_ + fVar229;
                  auVar358._0_4_ = (int)auVar397._0_4_;
                  auVar358._4_4_ = (int)auVar397._4_4_;
                  auVar358._8_4_ = (int)auVar397._8_4_;
                  auVar358._12_4_ = (int)auVar397._12_4_;
                  auVar397 = vpslld_avx(auVar358,0x17);
                  auVar397 = vpaddd_avx(auVar397,auVar231);
                  auVar71 = vfmadd213ps_fma(auVar397,auVar172,auVar231);
                  auVar173._8_4_ = 0x800000;
                  auVar173._0_8_ = 0x80000000800000;
                  auVar173._12_4_ = 0x800000;
                  auVar397 = vmaxps_avx(auVar71,auVar173);
                  auVar350 = vpsrld_avx(auVar397,0x17);
                  auVar287._8_4_ = 0xffffff82;
                  auVar287._0_8_ = 0xffffff82ffffff82;
                  auVar287._12_4_ = 0xffffff82;
                  auVar350 = vpaddd_avx(auVar350,auVar287);
                  auVar288._8_4_ = 0x807fffff;
                  auVar288._0_8_ = 0x807fffff807fffff;
                  auVar288._12_4_ = 0x807fffff;
                  auVar397 = vandps_avx(auVar397,auVar288);
                  auVar419 = vorps_avx(auVar397,auVar338);
                  auVar128 = vcvtdq2ps_avx(auVar350);
                  auVar289._8_4_ = 0x3f3504f3;
                  auVar289._0_8_ = 0x3f3504f33f3504f3;
                  auVar289._12_4_ = 0x3f3504f3;
                  auVar350 = vcmpps_avx(auVar419,auVar289,1);
                  auVar397 = vandps_avx(auVar350,auVar419);
                  auVar174._0_4_ = auVar397._0_4_ + auVar419._0_4_ + -1.0;
                  auVar174._4_4_ = auVar397._4_4_ + auVar419._4_4_ + -1.0;
                  auVar174._8_4_ = auVar397._8_4_ + auVar419._8_4_ + -1.0;
                  auVar174._12_4_ = auVar397._12_4_ + auVar419._12_4_ + -1.0;
                  auVar397 = vandps_avx(auVar350,auVar231);
                  auVar350 = vsubps_avx(auVar128,auVar397);
                  auVar392._0_4_ = auVar174._0_4_ * auVar174._0_4_;
                  auVar392._4_4_ = auVar174._4_4_ * auVar174._4_4_;
                  auVar392._8_4_ = auVar174._8_4_ * auVar174._8_4_;
                  auVar392._12_4_ = auVar174._12_4_ * auVar174._12_4_;
                  auVar402._8_4_ = 0x3d9021bb;
                  auVar402._0_8_ = 0x3d9021bb3d9021bb;
                  auVar402._12_4_ = 0x3d9021bb;
                  auVar290._8_4_ = 0xbdebd1b8;
                  auVar290._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar290._12_4_ = 0xbdebd1b8;
                  auVar397 = vfmadd213ps_fma(auVar402,auVar174,auVar290);
                  auVar291._8_4_ = 0x3def251a;
                  auVar291._0_8_ = 0x3def251a3def251a;
                  auVar291._12_4_ = 0x3def251a;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar174,auVar291);
                  auVar292._8_4_ = 0xbdfe5d4f;
                  auVar292._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar292._12_4_ = 0xbdfe5d4f;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar174,auVar292);
                  auVar293._8_4_ = 0x3e11e9bf;
                  auVar293._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar293._12_4_ = 0x3e11e9bf;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar174,auVar293);
                  auVar294._8_4_ = 0xbe2aae50;
                  auVar294._0_8_ = 0xbe2aae50be2aae50;
                  auVar294._12_4_ = 0xbe2aae50;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar174,auVar294);
                  auVar295._8_4_ = 0x3e4cceac;
                  auVar295._0_8_ = 0x3e4cceac3e4cceac;
                  auVar295._12_4_ = 0x3e4cceac;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar174,auVar295);
                  auVar296._8_4_ = 0xbe7ffffc;
                  auVar296._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar296._12_4_ = 0xbe7ffffc;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar174,auVar296);
                  auVar297._8_4_ = 0x3eaaaaaa;
                  auVar297._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar297._12_4_ = 0x3eaaaaaa;
                  auVar397 = vfmadd213ps_fma(auVar397,auVar174,auVar297);
                  auVar298._0_4_ = auVar397._0_4_ * auVar392._0_4_ * auVar174._0_4_;
                  auVar298._4_4_ = auVar397._4_4_ * auVar392._4_4_ * auVar174._4_4_;
                  auVar298._8_4_ = auVar397._8_4_ * auVar392._8_4_ * auVar174._8_4_;
                  auVar298._12_4_ = auVar397._12_4_ * auVar392._12_4_ * auVar174._12_4_;
                  auVar388 = ZEXT864(0) << 0x20;
                  auVar397 = vfmadd231ps_fma(auVar298,auVar350,auVar444);
                  auVar128 = vfmsub231ps_fma(auVar397,auVar338,auVar392);
                  auVar397 = vcmpps_avx(auVar71,ZEXT816(0) << 0x20,2);
                  auVar128 = vsubps_avx(auVar128,auVar174);
                  auVar350 = vfnmadd231ps_fma(auVar128,auVar426,auVar350);
                  auVar175._0_4_ = auVar350._0_4_ + auVar350._0_4_;
                  auVar175._4_4_ = auVar350._4_4_ + auVar350._4_4_;
                  auVar175._8_4_ = auVar350._8_4_ + auVar350._8_4_;
                  auVar175._12_4_ = auVar350._12_4_ + auVar350._12_4_;
                  auVar299._8_4_ = 0x7fffffff;
                  auVar299._0_8_ = 0x7fffffff7fffffff;
                  auVar299._12_4_ = 0x7fffffff;
                  auVar397 = vblendvps_avx(auVar175,auVar299,auVar397);
                  auVar300._8_4_ = 0x42b0c0a5;
                  auVar300._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar300._12_4_ = 0x42b0c0a5;
                  auVar397 = vminps_avx(auVar397,auVar300);
                  auVar301._8_4_ = 0xc2b0c0a5;
                  auVar301._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar301._12_4_ = 0xc2b0c0a5;
                  auVar128 = vmaxps_avx(auVar397,auVar301);
                  auVar397 = vfmadd213ps_fma(auVar449,auVar128,auVar338);
                  auVar359._0_4_ = (int)auVar397._0_4_;
                  auVar359._4_4_ = (int)auVar397._4_4_;
                  auVar359._8_4_ = (int)auVar397._8_4_;
                  auVar359._12_4_ = (int)auVar397._12_4_;
                  auVar350 = vcvtdq2ps_avx(auVar359);
                  auVar397 = vcmpps_avx(auVar397,auVar350,1);
                  auVar397 = vandps_avx(auVar397,auVar231);
                  auVar397 = vsubps_avx(auVar350,auVar397);
                  auVar350 = vfmsub231ps_fma(auVar128,auVar397,auVar426);
                  auVar128 = vfnmsub231ps_fma(auVar350,auVar397,auVar444);
                  auVar360._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                  auVar360._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                  auVar360._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                  auVar360._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                  auVar350 = vfmadd213ps_fma(auVar344,auVar128,auVar455);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar236);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar327);
                  auVar341 = ZEXT1664(auVar231);
                  auVar79._8_4_ = 0x3e2aaaaa;
                  auVar79._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar79._12_4_ = 0x3e2aaaaa;
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar79);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar128,auVar338);
                  auVar350 = vfmadd213ps_fma(auVar350,auVar360,auVar128);
                  auVar176._0_4_ = auVar350._0_4_ + fVar70;
                  auVar176._4_4_ = auVar350._4_4_ + fVar69;
                  auVar176._8_4_ = auVar350._8_4_ + fVar486;
                  auVar176._12_4_ = auVar350._12_4_ + fVar229;
                  auVar302._0_4_ = (int)auVar397._0_4_;
                  auVar302._4_4_ = (int)auVar397._4_4_;
                  auVar302._8_4_ = (int)auVar397._8_4_;
                  auVar302._12_4_ = (int)auVar397._12_4_;
                  auVar397 = vpslld_avx(auVar302,0x17);
                  auVar397 = vpaddd_avx(auVar397,auVar231);
                  auVar397 = vfmadd213ps_fma(auVar397,auVar176,auVar231);
                  auVar231 = vrcpps_avx(auVar397);
                  auVar361._0_4_ = auVar231._0_4_ + auVar231._0_4_;
                  auVar361._4_4_ = auVar231._4_4_ + auVar231._4_4_;
                  auVar361._8_4_ = auVar231._8_4_ + auVar231._8_4_;
                  auVar361._12_4_ = auVar231._12_4_ + auVar231._12_4_;
                  auVar80._8_4_ = 0x40000000;
                  auVar80._0_8_ = 0x4000000040000000;
                  auVar80._12_4_ = 0x40000000;
                  auVar397 = vfmsub213ps_fma(auVar397,auVar361,auVar80);
                  auVar231 = vfnmadd213ps_fma(auVar397,auVar231,auVar361);
                  auVar122 = vfmsub231ps_fma(auVar122,auVar122,auVar231);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar182._4_4_ = uVar1;
                  auVar182._0_4_ = uVar1;
                  auVar182._8_4_ = uVar1;
                  auVar182._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar303._4_4_ = uVar1;
                  auVar303._0_4_ = uVar1;
                  auVar303._8_4_ = uVar1;
                  auVar303._12_4_ = uVar1;
                  auVar350 = vfmadd231ps_fma(auVar303,auVar122,auVar182);
                  auVar397 = vmaxps_avx(auVar397,auVar350);
                  auVar231 = vminps_avx(auVar397,auVar231);
                  auVar122._0_4_ = auVar231._0_4_ * auVar122._0_4_;
                  auVar122._4_4_ = auVar231._4_4_ * fVar155;
                  auVar122._8_4_ = auVar231._8_4_ * fVar230;
                  auVar122._12_4_ = auVar231._12_4_ * fVar24;
                }
                *(undefined1 (*) [16])ppp_Var54 = auVar122;
                ppp_Var54 = ppp_Var54 + 2;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_a8.w);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    local_50._0_4_ = (uint)local_50 | uVar8 ^ 1;
    if (((uint)local_50 == 0) && (0 < (long)local_a8.c)) {
      p_Var48 = pp_Var58[-3];
      iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      uVar13 = *(undefined4 *)(&this->field_0x114 + (long)p_Var48);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar56 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      local_198 = 0;
      auVar153 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar459 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar154 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar388 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar339._8_4_ = 0x3f800000;
      auVar339._0_8_ = 0x3f8000003f800000;
      auVar339._12_4_ = 0x3f800000;
      auVar396 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
      auVar453 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
      auVar341 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
      auVar460 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
      do {
        if (0 < local_a8.h) {
          iVar52 = bottom_blob->w;
          iVar65 = bottom_blob->h;
          ppp_Var54 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar14 = bottom_blob->c;
          iVar49 = 0;
          do {
            if (0 < local_a8.w) {
              uVar62 = 0;
              iVar64 = (1 - uVar50) * iVar63;
              do {
                if (lVar59 == 0) {
                  auVar472 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar472 = *(undefined1 (*) [16])(lVar59 + local_198 * 0x10);
                }
                auVar485 = ZEXT1664(auVar472);
                if (0 < (int)uVar14) {
                  pvVar68 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar53 = 0;
                  do {
                    if (0 < (int)uVar56) {
                      uVar55 = 0;
                      uVar57 = 0;
                      do {
                        iVar40 = (((int)uVar57 - uVar56) + 1) * iVar9 + iVar49;
                        if ((((-1 < iVar40) && (iVar41 = iVar40 / iVar10, iVar40 % iVar10 == 0)) &&
                            (iVar41 < iVar65)) && (0 < (int)uVar50)) {
                          uVar61 = uVar55;
                          uVar66 = (ulong)uVar50;
                          iVar40 = iVar64;
                          do {
                            if (((-1 < iVar40) && (iVar42 = iVar40 / iVar67, iVar40 % iVar67 == 0))
                               && (iVar42 < iVar52)) {
                              uVar1 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar42 * 4 +
                                       (long)iVar41 * (long)bottom_blob->w * bottom_blob->elemsize +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar53);
                              auVar126._4_4_ = uVar1;
                              auVar126._0_4_ = uVar1;
                              auVar126._8_4_ = uVar1;
                              auVar126._12_4_ = uVar1;
                              auVar231 = vfmadd231ps_fma(auVar485._0_16_,auVar126,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar68 + (uVar61 & 0xffffffff) * 4
                                                          ));
                              auVar485 = ZEXT1664(auVar231);
                            }
                            uVar61 = uVar61 + 4;
                            iVar40 = iVar40 + iVar63;
                            uVar66 = uVar66 - 1;
                          } while (uVar66 != 0);
                        }
                        uVar57 = uVar57 + 1;
                        uVar55 = uVar55 + (ulong)uVar50 * 4;
                      } while (uVar57 != uVar56);
                    }
                    auVar472 = auVar485._0_16_;
                    pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar50 * uVar56 * 4) * 4);
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar14);
                }
                auVar128 = auVar153._0_16_;
                auVar397 = auVar388._0_16_;
                auVar350 = auVar396._0_16_;
                auVar231 = auVar341._0_16_;
                auVar72 = auVar460._0_16_;
                auVar112 = auVar453._0_16_;
                auVar71 = auVar154._0_16_;
                auVar419 = auVar459._0_16_;
                fVar70 = auVar472._4_4_;
                fVar69 = auVar472._8_4_;
                fVar486 = auVar472._12_4_;
                switch(uVar13) {
                case 1:
                  auVar472 = vmaxps_avx(auVar472,auVar128);
                  break;
                case 2:
                  auVar231 = vmaxps_avx(auVar472,auVar128);
                  auVar397 = vminps_avx(auVar472,auVar128);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar475._4_4_ = uVar1;
                  auVar475._0_4_ = uVar1;
                  auVar475._8_4_ = uVar1;
                  auVar475._12_4_ = uVar1;
                  auVar472 = vfmadd213ps_fma(auVar475,auVar397,auVar231);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar130._4_4_ = uVar1;
                  auVar130._0_4_ = uVar1;
                  auVar130._8_4_ = uVar1;
                  auVar130._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar365._4_4_ = uVar1;
                  auVar365._0_4_ = uVar1;
                  auVar365._8_4_ = uVar1;
                  auVar365._12_4_ = uVar1;
                  auVar231 = vmaxps_avx(auVar472,auVar130);
                  auVar472 = vminps_avx(auVar365,auVar231);
                  break;
                case 4:
                  auVar131._0_8_ = auVar472._0_8_ ^ 0x8000000080000000;
                  auVar131._8_4_ = -fVar69;
                  auVar131._12_4_ = -fVar486;
                  auVar87._8_4_ = 0x42b0c0a5;
                  auVar87._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar87._12_4_ = 0x42b0c0a5;
                  auVar128 = vminps_avx(auVar131,auVar87);
                  auVar364 = vmaxps_avx(auVar419,auVar128);
                  auVar128 = vfmadd213ps_fma(auVar71,auVar364,auVar397);
                  auVar473._0_4_ = (int)auVar128._0_4_;
                  auVar473._4_4_ = (int)auVar128._4_4_;
                  auVar473._8_4_ = (int)auVar128._8_4_;
                  auVar473._12_4_ = (int)auVar128._12_4_;
                  auVar419 = vcvtdq2ps_avx(auVar473);
                  auVar128 = vcmpps_avx(auVar128,auVar419,1);
                  auVar128 = vandps_avx(auVar128,auVar339);
                  auVar128 = vsubps_avx(auVar419,auVar128);
                  auVar350 = vfmsub231ps_fma(auVar364,auVar128,auVar350);
                  auVar188._8_4_ = 0x395e8083;
                  auVar188._0_8_ = 0x395e8083395e8083;
                  auVar188._12_4_ = 0x395e8083;
                  auVar350 = vfmsub231ps_fma(auVar350,auVar128,auVar188);
                  auVar474._0_4_ = auVar350._0_4_ * auVar350._0_4_;
                  auVar474._4_4_ = auVar350._4_4_ * auVar350._4_4_;
                  auVar474._8_4_ = auVar350._8_4_ * auVar350._8_4_;
                  auVar474._12_4_ = auVar350._12_4_ * auVar350._12_4_;
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar112);
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar72);
                  auVar189._8_4_ = 0x3d2aa9c1;
                  auVar189._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar189._12_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar189);
                  auVar88._8_4_ = 0x3e2aaaaa;
                  auVar88._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar88._12_4_ = 0x3e2aaaaa;
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar88);
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar397);
                  auVar231 = vfmadd213ps_fma(auVar231,auVar474,auVar350);
                  auVar132._0_4_ = auVar231._0_4_ + 1.0;
                  auVar132._4_4_ = auVar231._4_4_ + 1.0;
                  auVar132._8_4_ = auVar231._8_4_ + 1.0;
                  auVar132._12_4_ = auVar231._12_4_ + 1.0;
                  auVar366._0_4_ = (int)auVar128._0_4_;
                  auVar366._4_4_ = (int)auVar128._4_4_;
                  auVar366._8_4_ = (int)auVar128._8_4_;
                  auVar366._12_4_ = (int)auVar128._12_4_;
                  auVar231 = vpslld_avx(auVar366,0x17);
                  auVar231 = vpaddd_avx(auVar231,auVar339);
                  auVar397 = vfmadd213ps_fma(auVar231,auVar132,auVar339);
                  auVar231 = vrcpps_avx(auVar397);
                  auVar397 = vfmsub213ps_fma(auVar397,auVar231,auVar339);
                  auVar472 = vfnmadd132ps_fma(auVar397,auVar231,auVar231);
                  break;
                case 5:
                  auVar304._8_4_ = 0x42b0c0a5;
                  auVar304._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar304._12_4_ = 0x42b0c0a5;
                  auVar128 = vminps_avx(auVar472,auVar304);
                  auVar347 = vmaxps_avx(auVar419,auVar128);
                  auVar128 = vfmadd213ps_fma(auVar71,auVar347,auVar397);
                  auVar405._0_4_ = (int)auVar128._0_4_;
                  auVar405._4_4_ = (int)auVar128._4_4_;
                  auVar405._8_4_ = (int)auVar128._8_4_;
                  auVar405._12_4_ = (int)auVar128._12_4_;
                  auVar364 = vcvtdq2ps_avx(auVar405);
                  auVar128 = vcmpps_avx(auVar128,auVar364,1);
                  auVar128 = vandps_avx(auVar128,auVar339);
                  auVar128 = vsubps_avx(auVar364,auVar128);
                  auVar364 = vfmsub231ps_fma(auVar347,auVar128,auVar350);
                  auVar84._8_4_ = 0xb95e8083;
                  auVar84._0_8_ = 0xb95e8083b95e8083;
                  auVar84._12_4_ = 0xb95e8083;
                  auVar347 = vfnmsub231ps_fma(auVar364,auVar128,auVar84);
                  auVar406._0_4_ = auVar347._0_4_ * auVar347._0_4_;
                  auVar406._4_4_ = auVar347._4_4_ * auVar347._4_4_;
                  auVar406._8_4_ = auVar347._8_4_ * auVar347._8_4_;
                  auVar406._12_4_ = auVar347._12_4_ * auVar347._12_4_;
                  auVar364 = vfmadd213ps_fma(auVar231,auVar347,auVar112);
                  auVar364 = vfmadd213ps_fma(auVar364,auVar347,auVar72);
                  auVar328._8_4_ = 0x3d2aa9c1;
                  auVar328._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar328._12_4_ = 0x3d2aa9c1;
                  auVar364 = vfmadd213ps_fma(auVar364,auVar347,auVar328);
                  auVar329._8_4_ = 0x3e2aaaaa;
                  auVar329._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar329._12_4_ = 0x3e2aaaaa;
                  auVar364 = vfmadd213ps_fma(auVar364,auVar347,auVar329);
                  auVar364 = vfmadd213ps_fma(auVar364,auVar347,auVar397);
                  auVar364 = vfmadd213ps_fma(auVar364,auVar406,auVar347);
                  auVar183._0_4_ = auVar364._0_4_ + 1.0;
                  auVar183._4_4_ = auVar364._4_4_ + 1.0;
                  auVar183._8_4_ = auVar364._8_4_ + 1.0;
                  auVar183._12_4_ = auVar364._12_4_ + 1.0;
                  auVar127._0_4_ = (int)auVar128._0_4_;
                  auVar127._4_4_ = (int)auVar128._4_4_;
                  auVar127._8_4_ = (int)auVar128._8_4_;
                  auVar127._12_4_ = (int)auVar128._12_4_;
                  auVar128 = vpslld_avx(auVar127,0x17);
                  auVar128 = vpaddd_avx(auVar128,auVar339);
                  auVar73 = vfmadd213ps_fma(auVar128,auVar183,auVar339);
                  auVar184._8_4_ = 0x800000;
                  auVar184._0_8_ = 0x80000000800000;
                  auVar184._12_4_ = 0x800000;
                  auVar128 = vmaxps_avx(auVar73,auVar184);
                  auVar364 = vpsrld_avx(auVar128,0x17);
                  auVar330._8_4_ = 0xffffff82;
                  auVar330._0_8_ = 0xffffff82ffffff82;
                  auVar330._12_4_ = 0xffffff82;
                  auVar364 = vpaddd_avx(auVar364,auVar330);
                  auVar331._8_4_ = 0x807fffff;
                  auVar331._0_8_ = 0x807fffff807fffff;
                  auVar331._12_4_ = 0x807fffff;
                  auVar128 = vandps_avx(auVar128,auVar331);
                  auVar420 = vorps_avx(auVar128,auVar397);
                  auVar347 = vcvtdq2ps_avx(auVar364);
                  auVar332._8_4_ = 0x3f3504f3;
                  auVar332._0_8_ = 0x3f3504f33f3504f3;
                  auVar332._12_4_ = 0x3f3504f3;
                  auVar364 = vcmpps_avx(auVar420,auVar332,1);
                  auVar128 = vandps_avx(auVar364,auVar420);
                  auVar185._0_4_ = auVar128._0_4_ + auVar420._0_4_ + -1.0;
                  auVar185._4_4_ = auVar128._4_4_ + auVar420._4_4_ + -1.0;
                  auVar185._8_4_ = auVar128._8_4_ + auVar420._8_4_ + -1.0;
                  auVar185._12_4_ = auVar128._12_4_ + auVar420._12_4_ + -1.0;
                  auVar128 = vandps_avx(auVar364,auVar339);
                  auVar364 = vsubps_avx(auVar347,auVar128);
                  auVar393._0_4_ = auVar185._0_4_ * auVar185._0_4_;
                  auVar393._4_4_ = auVar185._4_4_ * auVar185._4_4_;
                  auVar393._8_4_ = auVar185._8_4_ * auVar185._8_4_;
                  auVar393._12_4_ = auVar185._12_4_ * auVar185._12_4_;
                  auVar407._8_4_ = 0x3d9021bb;
                  auVar407._0_8_ = 0x3d9021bb3d9021bb;
                  auVar407._12_4_ = 0x3d9021bb;
                  auVar305._8_4_ = 0xbdebd1b8;
                  auVar305._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar305._12_4_ = 0xbdebd1b8;
                  auVar128 = vfmadd213ps_fma(auVar407,auVar185,auVar305);
                  auVar306._8_4_ = 0x3def251a;
                  auVar306._0_8_ = 0x3def251a3def251a;
                  auVar306._12_4_ = 0x3def251a;
                  auVar128 = vfmadd213ps_fma(auVar128,auVar185,auVar306);
                  auVar307._8_4_ = 0xbdfe5d4f;
                  auVar307._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar307._12_4_ = 0xbdfe5d4f;
                  auVar128 = vfmadd213ps_fma(auVar128,auVar185,auVar307);
                  auVar308._8_4_ = 0x3e11e9bf;
                  auVar308._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar308._12_4_ = 0x3e11e9bf;
                  auVar128 = vfmadd213ps_fma(auVar128,auVar185,auVar308);
                  auVar309._8_4_ = 0xbe2aae50;
                  auVar309._0_8_ = 0xbe2aae50be2aae50;
                  auVar309._12_4_ = 0xbe2aae50;
                  auVar128 = vfmadd213ps_fma(auVar128,auVar185,auVar309);
                  auVar310._8_4_ = 0x3e4cceac;
                  auVar310._0_8_ = 0x3e4cceac3e4cceac;
                  auVar310._12_4_ = 0x3e4cceac;
                  auVar128 = vfmadd213ps_fma(auVar128,auVar185,auVar310);
                  auVar311._8_4_ = 0xbe7ffffc;
                  auVar311._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar311._12_4_ = 0xbe7ffffc;
                  auVar128 = vfmadd213ps_fma(auVar128,auVar185,auVar311);
                  auVar312._8_4_ = 0x3eaaaaaa;
                  auVar312._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar312._12_4_ = 0x3eaaaaaa;
                  auVar128 = vfmadd213ps_fma(auVar128,auVar185,auVar312);
                  auVar313._0_4_ = auVar128._0_4_ * auVar393._0_4_ * auVar185._0_4_;
                  auVar313._4_4_ = auVar128._4_4_ * auVar393._4_4_ * auVar185._4_4_;
                  auVar313._8_4_ = auVar128._8_4_ * auVar393._8_4_ * auVar185._8_4_;
                  auVar313._12_4_ = auVar128._12_4_ * auVar393._12_4_ * auVar185._12_4_;
                  auVar408._8_4_ = 0xb95e8083;
                  auVar408._0_8_ = 0xb95e8083b95e8083;
                  auVar408._12_4_ = 0xb95e8083;
                  auVar128 = vfmadd231ps_fma(auVar313,auVar364,auVar408);
                  auVar347 = vfmsub231ps_fma(auVar128,auVar397,auVar393);
                  auVar459 = ZEXT1664(auVar419);
                  auVar154 = ZEXT1664(auVar71);
                  auVar453 = ZEXT1664(auVar112);
                  auVar460 = ZEXT1664(auVar72);
                  auVar341 = ZEXT1664(auVar231);
                  auVar396 = ZEXT1664(auVar350);
                  auVar38._12_4_ = 0;
                  auVar38._0_12_ = ZEXT412(0);
                  auVar153 = ZEXT1264(ZEXT412(0)) << 0x20;
                  auVar128 = vcmpps_avx(auVar73,auVar38 << 0x20,2);
                  auVar347 = vsubps_avx(auVar347,auVar185);
                  auVar364 = vfnmadd231ps_fma(auVar347,auVar350,auVar364);
                  auVar186._0_4_ = auVar364._0_4_ + auVar364._0_4_;
                  auVar186._4_4_ = auVar364._4_4_ + auVar364._4_4_;
                  auVar186._8_4_ = auVar364._8_4_ + auVar364._8_4_;
                  auVar186._12_4_ = auVar364._12_4_ + auVar364._12_4_;
                  auVar314._8_4_ = 0x7fffffff;
                  auVar314._0_8_ = 0x7fffffff7fffffff;
                  auVar314._12_4_ = 0x7fffffff;
                  auVar128 = vblendvps_avx(auVar186,auVar314,auVar128);
                  auVar128 = vminps_avx(auVar304,auVar128);
                  auVar364 = vmaxps_avx(auVar419,auVar128);
                  auVar128 = vfmadd213ps_fma(auVar71,auVar364,auVar397);
                  auVar315._0_4_ = (int)auVar128._0_4_;
                  auVar315._4_4_ = (int)auVar128._4_4_;
                  auVar315._8_4_ = (int)auVar128._8_4_;
                  auVar315._12_4_ = (int)auVar128._12_4_;
                  auVar419 = vcvtdq2ps_avx(auVar315);
                  auVar128 = vcmpps_avx(auVar128,auVar419,1);
                  auVar128 = vandps_avx(auVar128,auVar339);
                  auVar128 = vsubps_avx(auVar419,auVar128);
                  auVar350 = vfmsub231ps_fma(auVar364,auVar128,auVar350);
                  auVar316._8_4_ = 0xb95e8083;
                  auVar316._0_8_ = 0xb95e8083b95e8083;
                  auVar316._12_4_ = 0xb95e8083;
                  auVar350 = vfnmsub231ps_fma(auVar350,auVar128,auVar316);
                  auVar317._0_4_ = auVar350._0_4_ * auVar350._0_4_;
                  auVar317._4_4_ = auVar350._4_4_ * auVar350._4_4_;
                  auVar317._8_4_ = auVar350._8_4_ * auVar350._8_4_;
                  auVar317._12_4_ = auVar350._12_4_ * auVar350._12_4_;
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar112);
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar72);
                  auVar333._8_4_ = 0x3d2aa9c1;
                  auVar333._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar333._12_4_ = 0x3d2aa9c1;
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar333);
                  auVar388 = ZEXT1664(auVar397);
                  auVar85._8_4_ = 0x3e2aaaaa;
                  auVar85._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar85._12_4_ = 0x3e2aaaaa;
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar85);
                  auVar231 = vfmadd213ps_fma(auVar231,auVar350,auVar397);
                  auVar231 = vfmadd213ps_fma(auVar231,auVar317,auVar350);
                  auVar129._0_4_ = auVar231._0_4_ + 1.0;
                  auVar129._4_4_ = auVar231._4_4_ + 1.0;
                  auVar129._8_4_ = auVar231._8_4_ + 1.0;
                  auVar129._12_4_ = auVar231._12_4_ + 1.0;
                  auVar187._0_4_ = (int)auVar128._0_4_;
                  auVar187._4_4_ = (int)auVar128._4_4_;
                  auVar187._8_4_ = (int)auVar128._8_4_;
                  auVar187._12_4_ = (int)auVar128._12_4_;
                  auVar231 = vpslld_avx(auVar187,0x17);
                  auVar231 = vpaddd_avx(auVar231,auVar339);
                  auVar397 = vfmadd213ps_fma(auVar231,auVar129,auVar339);
                  auVar231 = vrcpps_avx(auVar397);
                  auVar318._0_4_ = auVar231._0_4_ + auVar231._0_4_;
                  auVar318._4_4_ = auVar231._4_4_ + auVar231._4_4_;
                  auVar318._8_4_ = auVar231._8_4_ + auVar231._8_4_;
                  auVar318._12_4_ = auVar231._12_4_ + auVar231._12_4_;
                  auVar86._8_4_ = 0x40000000;
                  auVar86._0_8_ = 0x4000000040000000;
                  auVar86._12_4_ = 0x40000000;
                  auVar397 = vfmsub213ps_fma(auVar397,auVar318,auVar86);
                  auVar231 = vfnmadd213ps_fma(auVar397,auVar231,auVar318);
                  auVar472 = vfmsub231ps_fma(auVar472,auVar472,auVar231);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var48);
                  auVar133._4_4_ = uVar1;
                  auVar133._0_4_ = uVar1;
                  auVar133._8_4_ = uVar1;
                  auVar133._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar190._4_4_ = uVar1;
                  auVar190._0_4_ = uVar1;
                  auVar190._8_4_ = uVar1;
                  auVar190._12_4_ = uVar1;
                  auVar231 = vfmadd231ps_fma(auVar190,auVar472,auVar133);
                  auVar231 = vmaxps_avx(auVar128,auVar231);
                  auVar231 = vminps_avx(auVar231,auVar339);
                  auVar472._0_4_ = auVar472._0_4_ * auVar231._0_4_;
                  auVar472._4_4_ = fVar70 * auVar231._4_4_;
                  auVar472._8_4_ = fVar69 * auVar231._8_4_;
                  auVar472._12_4_ = fVar486 * auVar231._12_4_;
                }
                *(undefined1 (*) [16])ppp_Var54 = auVar472;
                ppp_Var54 = ppp_Var54 + 2;
                uVar62 = uVar62 + 1;
                iVar64 = iVar64 + 1;
              } while (uVar62 != local_a8.w);
            }
            iVar49 = iVar49 + 1;
          } while (iVar49 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar8 == 4 && (local_134 ^ 1) == 0) && (local_50 = (long)local_a8.c, 0 < local_50)) {
      p_Var48 = pp_Var58[-3];
      iVar63 = *(int *)(&this->field_0xdc + (long)p_Var48);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var48);
      iVar67 = *(int *)(&this->field_0xe4 + (long)p_Var48);
      iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var48);
      iVar52 = *(int *)(&this->field_0x114 + (long)p_Var48);
      lVar59 = *(long *)(&this->field_0x1a8 + (long)p_Var48);
      uVar50 = *(uint *)(&this->field_0xd4 + (long)p_Var48);
      uVar56 = *(uint *)(&this->field_0xd8 + (long)p_Var48);
      lVar47 = local_a8.elemsize * local_a8.cstep;
      local_38 = (Allocator *)local_a8.data;
      iVar65 = bottom_blob->w;
      iVar49 = bottom_blob->h;
      uVar14 = bottom_blob->c;
      local_198 = 0;
      do {
        if (0 < iVar7) {
          sVar17 = (this->weight_data_tm).cstep;
          sVar18 = (this->weight_data_tm).elemsize;
          local_150 = (_func_int ***)((long)&local_38->_vptr_Allocator + lVar47 * local_198);
          pvVar68 = (this->weight_data_tm).data;
          iVar64 = 0;
          do {
            if (0 < iVar6) {
              iVar41 = bottom_blob->w;
              pvVar16 = bottom_blob->data;
              sVar19 = bottom_blob->elemsize;
              sVar20 = bottom_blob->cstep;
              pfVar21 = *(float **)(&this->field_0x118 + (long)p_Var48);
              uVar62 = 0;
              iVar40 = (1 - uVar50) * iVar63;
              do {
                if (lVar59 == 0) {
                  fVar70 = 0.0;
                }
                else {
                  fVar70 = *(float *)(lVar59 + local_198 * 4);
                }
                if ((int)uVar14 < 1) {
                  auVar231 = SUB6416(ZEXT864(0),0);
                }
                else {
                  auVar341 = ZEXT864(0);
                  uVar53 = 0;
                  pvVar60 = (void *)(sVar17 * local_198 * sVar18 + (long)pvVar68);
                  do {
                    if (0 < (int)uVar56) {
                      uVar57 = 0;
                      uVar55 = 0;
                      do {
                        iVar42 = (((int)uVar55 - uVar56) + 1) * iVar9 + iVar64;
                        if ((((-1 < iVar42) && (iVar43 = iVar42 / iVar10, iVar42 % iVar10 == 0)) &&
                            (0 < (int)uVar50)) && (iVar43 < iVar49)) {
                          uVar61 = (ulong)uVar50;
                          uVar66 = uVar57;
                          iVar42 = iVar40;
                          do {
                            if (((-1 < iVar42) && (iVar44 = iVar42 / iVar67, iVar42 % iVar67 == 0))
                               && (iVar44 < iVar65)) {
                              auVar231 = vfmadd231ps_fma(auVar341._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar16 +
                                                          (long)(iVar44 << 2) * 4 +
                                                          (long)iVar43 * (long)iVar41 * sVar19 +
                                                          sVar20 * sVar19 * uVar53),
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar60 + (uVar66 & 0xffffffff) * 4
                                                          ));
                              auVar341 = ZEXT1664(auVar231);
                            }
                            uVar66 = uVar66 + 4;
                            iVar42 = iVar42 + iVar63;
                            uVar61 = uVar61 - 1;
                          } while (uVar61 != 0);
                        }
                        uVar55 = uVar55 + 1;
                        uVar57 = uVar57 + (ulong)uVar50 * 4;
                      } while (uVar55 != uVar56);
                    }
                    auVar231 = auVar341._0_16_;
                    pvVar60 = (void *)((long)pvVar60 + (long)(int)(uVar50 * uVar56 * 4) * 4);
                    uVar53 = uVar53 + 1;
                  } while (uVar53 != uVar14);
                }
                auVar397 = vshufpd_avx(auVar231,auVar231,1);
                auVar134._0_4_ = auVar397._0_4_ + auVar231._0_4_;
                auVar134._4_4_ = auVar397._4_4_ + auVar231._4_4_;
                auVar134._8_4_ = auVar397._8_4_ + auVar231._8_4_;
                auVar134._12_4_ = auVar397._12_4_ + auVar231._12_4_;
                auVar231 = vmovshdup_avx(auVar134);
                fVar70 = auVar231._0_4_ + fVar70 + auVar134._0_4_;
                auVar231 = ZEXT416((uint)fVar70);
                fVar69 = fVar70;
                if (iVar52 - 1U < 6) {
                  switch(iVar52) {
                  case 1:
                    auVar231 = vmaxss_avx(ZEXT416((uint)fVar70),ZEXT416(0));
                    fVar69 = auVar231._0_4_;
                    break;
                  case 2:
                    auVar89._0_12_ = ZEXT812(0);
                    auVar89._12_4_ = 0;
                    auVar231 = vcmpss_avx(auVar89,ZEXT416((uint)fVar70),1);
                    auVar192._8_4_ = 0x3f800000;
                    auVar192._0_8_ = 0x3f8000003f800000;
                    auVar192._12_4_ = 0x3f800000;
                    auVar231 = vblendvps_avx(ZEXT416((uint)*pfVar21),auVar192,auVar231);
                    fVar69 = auVar231._0_4_ * fVar70;
                    break;
                  case 3:
                    auVar231 = vmaxss_avx(auVar231,ZEXT416((uint)*pfVar21));
                    fVar69 = auVar231._0_4_;
                    if (pfVar21[1] < auVar231._0_4_) {
                      fVar69 = pfVar21[1];
                    }
                    break;
                  case 4:
                    auVar231 = vminss_avx(auVar231,ZEXT416(0x42b0c0a5));
                    auVar135._0_8_ = auVar231._0_8_ ^ 0x8000000080000000;
                    auVar135._8_4_ = auVar231._8_4_ ^ 0x80000000;
                    auVar135._12_4_ = auVar231._12_4_ ^ 0x80000000;
                    auVar231 = vcmpss_avx(auVar231,ZEXT416(0xc2b0c0a5),1);
                    auVar191._8_4_ = 0x42b0c0a5;
                    auVar191._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar191._12_4_ = 0x42b0c0a5;
                    auVar231 = vblendvps_avx(auVar135,auVar191,auVar231);
                    fVar70 = expf(auVar231._0_4_);
                    fVar69 = 1.0 / (fVar70 + 1.0);
                    break;
                  case 5:
                    fVar69 = expf(fVar70);
                    fVar69 = logf(fVar69 + 1.0);
                    fVar69 = tanhf(fVar69);
                    fVar69 = fVar69 * fVar70;
                    break;
                  case 6:
                    fVar486 = *pfVar21;
                    fVar229 = -pfVar21[1] / fVar486;
                    fVar69 = 0.0;
                    if ((fVar229 <= fVar70) && (fVar69 = fVar70, fVar70 <= fVar229 + 1.0 / fVar486))
                    {
                      auVar231 = vfmadd213ss_fma(ZEXT416((uint)fVar486),auVar231,
                                                 ZEXT416((uint)pfVar21[1]));
                      fVar69 = auVar231._0_4_ * fVar70;
                    }
                  }
                }
                *(float *)local_150 = fVar69;
                local_150 = (_func_int ***)((long)local_150 + 4);
                uVar62 = uVar62 + 1;
                iVar40 = iVar40 + 1;
              } while (uVar62 != iVar6);
            }
            iVar64 = iVar64 + 1;
          } while (iVar64 != iVar7);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_50);
    }
    iVar7 = local_a8.h;
    iVar6 = local_a8.w;
    pvVar68 = local_a8.data;
    pp_Var58 = this->_vptr_Deconvolution_x86_fma;
    if (((local_134 ^ 1) == 0 && uVar8 == 1) &&
       (p_Var48 = pp_Var58[-3], 0 < *(int *)(&this->field_0xd0 + (long)p_Var48))) {
      lVar59 = local_a8.cstep * local_a8.elemsize;
      iVar63 = bottom_blob->w;
      iVar9 = bottom_blob->h;
      uVar8 = bottom_blob->c;
      uVar53 = (ulong)(uint)local_a8.w;
      lVar47 = (long)local_a8.w;
      local_58 = (Allocator *)CONCAT44(local_58._4_4_,-(int)local_58);
      local_170 = 0;
      do {
        if (0 < iVar7) {
          local_168 = (_func_int ***)((long)(_func_int ***)pvVar68 + lVar59 * local_170);
          pp_Var22 = this->_vptr_Deconvolution_x86_fma;
          sVar17 = (this->weight_data_tm).cstep;
          sVar18 = (this->weight_data_tm).elemsize;
          pvVar16 = (this->weight_data_tm).data;
          iVar67 = 0;
          do {
            if (0 < iVar6) {
              iVar10 = bottom_blob->w;
              pvVar60 = bottom_blob->data;
              sVar19 = bottom_blob->elemsize;
              sVar20 = bottom_blob->cstep;
              pp_Var23 = this->_vptr_Deconvolution_x86_fma;
              iVar52 = iVar67 - (int)local_60;
              local_b0 = (ulong)local_58 & 0xffffffff;
              uVar55 = 0;
              do {
                p_Var48 = pp_Var22[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var48) == 0) {
                  auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar341 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var48) +
                                              local_170 * 4));
                }
                auVar231 = auVar341._0_16_;
                if (0 < (int)uVar8) {
                  p_Var51 = pp_Var23[-3];
                  uVar57 = 0;
                  local_140 = (void *)(sVar17 * sVar18 * local_170 + (long)pvVar16);
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var51)) {
                      iVar65 = 0;
                      do {
                        iVar49 = *(int *)(&this->field_0xe0 + (long)p_Var51) * iVar65 + iVar52;
                        if (((-1 < iVar49) &&
                            (iVar64 = iVar49 / *(int *)(&this->field_0xe8 + (long)p_Var51),
                            iVar49 % *(int *)(&this->field_0xe8 + (long)p_Var51) == 0)) &&
                           (iVar64 < iVar9)) {
                          iVar49 = *(int *)(&this->field_0xd4 + (long)p_Var51);
                          if (0 < (long)iVar49) {
                            lVar45 = 0;
                            iVar40 = (int)local_b0;
                            do {
                              if (((-1 < iVar40) &&
                                  (iVar41 = iVar40 / *(int *)(&this->field_0xe4 + (long)p_Var51),
                                  iVar40 % *(int *)(&this->field_0xe4 + (long)p_Var51) == 0)) &&
                                 (iVar41 < iVar63)) {
                                auVar231 = vfmadd231ss_fma(auVar341._0_16_,
                                                           ZEXT416(*(uint *)((long)local_140 +
                                                                            lVar45 * 4 +
                                                                            (ulong)(uint)(iVar49 * 
                                                  iVar65) * 4)),
                                                  ZEXT416(*(uint *)((long)pvVar60 +
                                                                   (long)iVar41 * 4 +
                                                                   (long)iVar64 *
                                                                   (long)iVar10 * sVar19 +
                                                                   sVar20 * sVar19 * uVar57)));
                                auVar341 = ZEXT1664(auVar231);
                              }
                              lVar45 = lVar45 + 1;
                              iVar40 = iVar40 + *(int *)(&this->field_0xdc + (long)p_Var51);
                            } while (iVar49 != lVar45);
                          }
                        }
                        iVar65 = iVar65 + 1;
                      } while (iVar65 != *(int *)(&this->field_0xd8 + (long)p_Var51));
                    }
                    auVar231 = auVar341._0_16_;
                    uVar57 = uVar57 + 1;
                    local_140 = (void *)((long)local_140 + (long)(int)(uVar12 * uVar11) * 4);
                  } while (uVar57 != uVar8);
                }
                fVar69 = auVar231._0_4_;
                fVar70 = fVar69;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var48)) {
                case 1:
                  auVar231 = vmaxss_avx(auVar231,ZEXT416(0));
                  fVar70 = auVar231._0_4_;
                  break;
                case 2:
                  auVar231 = vcmpss_avx(ZEXT816(0) << 0x40,auVar231,1);
                  auVar194._8_4_ = 0x3f800000;
                  auVar194._0_8_ = 0x3f8000003f800000;
                  auVar194._12_4_ = 0x3f800000;
                  auVar231 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var48)),
                                           auVar194,auVar231);
                  fVar70 = auVar231._0_4_ * fVar69;
                  break;
                case 3:
                  fVar69 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var48))[1];
                  auVar231 = vmaxss_avx(auVar231,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var48)));
                  fVar70 = auVar231._0_4_;
                  if (fVar69 < auVar231._0_4_) {
                    fVar70 = fVar69;
                  }
                  break;
                case 4:
                  auVar231 = vminss_avx(auVar231,ZEXT416(0x42b0c0a5));
                  auVar136._0_8_ = auVar231._0_8_ ^ 0x8000000080000000;
                  auVar136._8_4_ = auVar231._8_4_ ^ 0x80000000;
                  auVar136._12_4_ = auVar231._12_4_ ^ 0x80000000;
                  auVar231 = vcmpss_avx(auVar231,ZEXT416(0xc2b0c0a5),1);
                  auVar193._8_4_ = 0x42b0c0a5;
                  auVar193._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar193._12_4_ = 0x42b0c0a5;
                  auVar231 = vblendvps_avx(auVar136,auVar193,auVar231);
                  fVar70 = expf(auVar231._0_4_);
                  fVar70 = 1.0 / (fVar70 + 1.0);
                  break;
                case 5:
                  fVar70 = expf(fVar69);
                  fVar70 = logf(fVar70 + 1.0);
                  fVar70 = tanhf(fVar70);
                  fVar70 = fVar70 * fVar69;
                  break;
                case 6:
                  fVar486 = **(float **)(&this->field_0x118 + (long)p_Var48);
                  fVar229 = (*(float **)(&this->field_0x118 + (long)p_Var48))[1];
                  fVar230 = -fVar229 / fVar486;
                  fVar70 = 0.0;
                  if ((fVar230 <= fVar69) && (fVar70 = fVar69, fVar69 <= fVar230 + 1.0 / fVar486)) {
                    auVar231 = vfmadd213ss_fma(ZEXT416((uint)fVar486),auVar231,
                                               ZEXT416((uint)fVar229));
                    fVar70 = auVar231._0_4_ * fVar69;
                  }
                }
                *(float *)((long)local_168 + uVar55 * 4) = fVar70;
                uVar55 = uVar55 + 1;
                local_b0 = (ulong)((int)local_b0 + 1);
              } while (uVar55 != uVar53);
            }
            local_168 = (_func_int ***)((long)local_168 + lVar47 * 4);
            iVar67 = iVar67 + 1;
          } while (iVar67 != iVar7);
          p_Var48 = pp_Var58[-3];
        }
        local_170 = local_170 + 1;
      } while (local_170 < *(int *)(&this->field_0xd0 + (long)p_Var48));
      goto LAB_002a59b2;
    }
  }
  pMVar39 = local_48;
  Deconvolution::cut_padding
            ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86_fma + (long)pp_Var58[-3]),
             &local_a8,local_48,local_40);
  if ((pMVar39->data == (void *)0x0) || (iVar63 = 0, (long)pMVar39->c * pMVar39->cstep == 0)) {
    iVar63 = -100;
  }
LAB_002a59fd:
  piVar15 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar63;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}